

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx2::CurveNvIntersectorK<4,4>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  Primitive PVar9;
  int iVar10;
  RTCFilterFunctionN p_Var11;
  code *pcVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long lVar21;
  ulong uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  bool bVar72;
  bool bVar73;
  long lVar74;
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  float fVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [28];
  uint uVar91;
  ulong uVar92;
  uint uVar93;
  ulong uVar94;
  Geometry *pGVar95;
  long lVar96;
  ulong uVar97;
  undefined4 uVar98;
  undefined8 uVar100;
  float fVar117;
  vint4 bi_2;
  undefined1 auVar101 [16];
  float fVar119;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar99;
  float fVar116;
  float fVar118;
  float fVar120;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar124;
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar144;
  undefined1 auVar143 [64];
  undefined1 extraout_var [56];
  float fVar145;
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar160;
  undefined1 auVar159 [32];
  float fVar161;
  float fVar167;
  vint4 ai_2;
  undefined1 auVar164 [32];
  undefined1 auVar162 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  vint4 ai;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  vint4 bi;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [32];
  undefined1 auVar193 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [64];
  vint4 ai_1;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar212;
  undefined1 auVar210 [32];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  undefined1 auVar206 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar211 [64];
  undefined1 auVar216 [16];
  undefined1 auVar217 [64];
  undefined4 uVar218;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar234;
  float fVar235;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_800 [32];
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [16];
  undefined8 local_770;
  undefined8 uStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  RTCFilterFunctionNArguments local_6f0;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  undefined8 uStack_638;
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 (*local_608) [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 auStack_510 [16];
  undefined1 local_500 [2] [32];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  undefined1 auStack_41c [8];
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined1 local_370 [16];
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  int local_2e0;
  int local_2dc;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined1 local_280 [32];
  float local_260 [4];
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  uint local_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar163 [32];
  undefined1 auVar205 [16];
  
  PVar9 = prim[1];
  uVar97 = (ulong)(byte)PVar9;
  lVar74 = uVar97 * 0x19;
  fVar146 = *(float *)(prim + lVar74 + 0x12);
  auVar173 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar173 = vinsertps_avx(auVar173,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar173 = vsubps_avx(auVar173,*(undefined1 (*) [16])(prim + lVar74 + 6));
  auVar101._0_4_ = fVar146 * auVar173._0_4_;
  auVar101._4_4_ = fVar146 * auVar173._4_4_;
  auVar101._8_4_ = fVar146 * auVar173._8_4_;
  auVar101._12_4_ = fVar146 * auVar173._12_4_;
  auVar183._0_4_ = fVar146 * auVar13._0_4_;
  auVar183._4_4_ = fVar146 * auVar13._4_4_;
  auVar183._8_4_ = fVar146 * auVar13._8_4_;
  auVar183._12_4_ = fVar146 * auVar13._12_4_;
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 4 + 6)));
  auVar173 = vcvtdq2ps_avx(auVar173);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 5 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 6 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar178 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xb + 6)));
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar97 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  uVar92 = (ulong)(uint)((int)(uVar97 * 9) * 2);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 + uVar97 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar92 = (ulong)(uint)((int)(uVar97 * 5) << 2);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 + 6)));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar230._4_4_ = auVar183._0_4_;
  auVar230._0_4_ = auVar183._0_4_;
  auVar230._8_4_ = auVar183._0_4_;
  auVar230._12_4_ = auVar183._0_4_;
  auVar126 = vshufps_avx(auVar183,auVar183,0x55);
  auVar102 = vshufps_avx(auVar183,auVar183,0xaa);
  fVar146 = auVar102._0_4_;
  auVar219._0_4_ = fVar146 * auVar15._0_4_;
  fVar145 = auVar102._4_4_;
  auVar219._4_4_ = fVar145 * auVar15._4_4_;
  fVar117 = auVar102._8_4_;
  auVar219._8_4_ = fVar117 * auVar15._8_4_;
  fVar119 = auVar102._12_4_;
  auVar219._12_4_ = fVar119 * auVar15._12_4_;
  auVar216._0_4_ = auVar17._0_4_ * fVar146;
  auVar216._4_4_ = auVar17._4_4_ * fVar145;
  auVar216._8_4_ = auVar17._8_4_ * fVar117;
  auVar216._12_4_ = auVar17._12_4_ * fVar119;
  auVar201._0_4_ = auVar147._0_4_ * fVar146;
  auVar201._4_4_ = auVar147._4_4_ * fVar145;
  auVar201._8_4_ = auVar147._8_4_ * fVar117;
  auVar201._12_4_ = auVar147._12_4_ * fVar119;
  auVar102 = vfmadd231ps_fma(auVar219,auVar126,auVar13);
  auVar127 = vfmadd231ps_fma(auVar216,auVar126,auVar16);
  auVar126 = vfmadd231ps_fma(auVar201,auVar103,auVar126);
  auVar162 = vfmadd231ps_fma(auVar102,auVar230,auVar173);
  auVar127 = vfmadd231ps_fma(auVar127,auVar230,auVar178);
  auVar217 = ZEXT1664(auVar127);
  auVar169 = vfmadd231ps_fma(auVar126,auVar104,auVar230);
  auVar231._4_4_ = auVar101._0_4_;
  auVar231._0_4_ = auVar101._0_4_;
  auVar231._8_4_ = auVar101._0_4_;
  auVar231._12_4_ = auVar101._0_4_;
  auVar126 = vshufps_avx(auVar101,auVar101,0x55);
  auVar102 = vshufps_avx(auVar101,auVar101,0xaa);
  fVar146 = auVar102._0_4_;
  auVar184._0_4_ = fVar146 * auVar15._0_4_;
  fVar145 = auVar102._4_4_;
  auVar184._4_4_ = fVar145 * auVar15._4_4_;
  fVar117 = auVar102._8_4_;
  auVar184._8_4_ = fVar117 * auVar15._8_4_;
  fVar119 = auVar102._12_4_;
  auVar184._12_4_ = fVar119 * auVar15._12_4_;
  auVar125._0_4_ = auVar17._0_4_ * fVar146;
  auVar125._4_4_ = auVar17._4_4_ * fVar145;
  auVar125._8_4_ = auVar17._8_4_ * fVar117;
  auVar125._12_4_ = auVar17._12_4_ * fVar119;
  auVar102._0_4_ = auVar147._0_4_ * fVar146;
  auVar102._4_4_ = auVar147._4_4_ * fVar145;
  auVar102._8_4_ = auVar147._8_4_ * fVar117;
  auVar102._12_4_ = auVar147._12_4_ * fVar119;
  auVar13 = vfmadd231ps_fma(auVar184,auVar126,auVar13);
  auVar15 = vfmadd231ps_fma(auVar125,auVar126,auVar16);
  auVar16 = vfmadd231ps_fma(auVar102,auVar126,auVar103);
  auVar17 = vfmadd231ps_fma(auVar13,auVar231,auVar173);
  auVar103 = vfmadd231ps_fma(auVar15,auVar231,auVar178);
  auVar147 = vfmadd231ps_fma(auVar16,auVar231,auVar104);
  local_150._8_4_ = 0x7fffffff;
  local_150._0_8_ = 0x7fffffff7fffffff;
  local_150._12_4_ = 0x7fffffff;
  auVar173 = vandps_avx(auVar162,local_150);
  auVar168._8_4_ = 0x219392ef;
  auVar168._0_8_ = 0x219392ef219392ef;
  auVar168._12_4_ = 0x219392ef;
  auVar173 = vcmpps_avx(auVar173,auVar168,1);
  auVar13 = vblendvps_avx(auVar162,auVar168,auVar173);
  auVar173 = vandps_avx(auVar127,local_150);
  auVar173 = vcmpps_avx(auVar173,auVar168,1);
  auVar15 = vblendvps_avx(auVar127,auVar168,auVar173);
  auVar173 = vandps_avx(auVar169,local_150);
  auVar173 = vcmpps_avx(auVar173,auVar168,1);
  auVar173 = vblendvps_avx(auVar169,auVar168,auVar173);
  auVar178 = vrcpps_avx(auVar13);
  auVar197._8_4_ = 0x3f800000;
  auVar197._0_8_ = &DAT_3f8000003f800000;
  auVar197._12_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar13,auVar178,auVar197);
  auVar178 = vfmadd132ps_fma(auVar13,auVar178,auVar178);
  auVar13 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar13,auVar197);
  auVar16 = vfmadd132ps_fma(auVar15,auVar13,auVar13);
  auVar13 = vrcpps_avx(auVar173);
  auVar173 = vfnmadd213ps_fma(auVar173,auVar13,auVar197);
  auVar104 = vfmadd132ps_fma(auVar173,auVar13,auVar13);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = *(ulong *)(prim + uVar97 * 7 + 6);
  auVar173 = vpmovsxwd_avx(auVar173);
  auVar173 = vcvtdq2ps_avx(auVar173);
  auVar173 = vsubps_avx(auVar173,auVar17);
  auVar169._0_4_ = auVar178._0_4_ * auVar173._0_4_;
  auVar169._4_4_ = auVar178._4_4_ * auVar173._4_4_;
  auVar169._8_4_ = auVar178._8_4_ * auVar173._8_4_;
  auVar169._12_4_ = auVar178._12_4_ * auVar173._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar97 * 9 + 6);
  auVar173 = vpmovsxwd_avx(auVar13);
  auVar173 = vcvtdq2ps_avx(auVar173);
  auVar173 = vsubps_avx(auVar173,auVar17);
  auVar185._0_4_ = auVar178._0_4_ * auVar173._0_4_;
  auVar185._4_4_ = auVar178._4_4_ * auVar173._4_4_;
  auVar185._8_4_ = auVar178._8_4_ * auVar173._8_4_;
  auVar185._12_4_ = auVar178._12_4_ * auVar173._12_4_;
  auVar127._1_3_ = 0;
  auVar127[0] = PVar9;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar13 = vpmovsxwd_avx(auVar15);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar97 * -2 + 6);
  auVar173 = vpmovsxwd_avx(auVar178);
  auVar173 = vcvtdq2ps_avx(auVar173);
  auVar173 = vsubps_avx(auVar173,auVar103);
  auVar202._0_4_ = auVar173._0_4_ * auVar16._0_4_;
  auVar202._4_4_ = auVar173._4_4_ * auVar16._4_4_;
  auVar202._8_4_ = auVar173._8_4_ * auVar16._8_4_;
  auVar202._12_4_ = auVar173._12_4_ * auVar16._12_4_;
  auVar173 = vcvtdq2ps_avx(auVar13);
  auVar173 = vsubps_avx(auVar173,auVar103);
  auVar126._0_4_ = auVar16._0_4_ * auVar173._0_4_;
  auVar126._4_4_ = auVar16._4_4_ * auVar173._4_4_;
  auVar126._8_4_ = auVar16._8_4_ * auVar173._8_4_;
  auVar126._12_4_ = auVar16._12_4_ * auVar173._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar92 + uVar97 + 6);
  auVar173 = vpmovsxwd_avx(auVar16);
  auVar173 = vcvtdq2ps_avx(auVar173);
  auVar173 = vsubps_avx(auVar173,auVar147);
  auVar162._0_4_ = auVar104._0_4_ * auVar173._0_4_;
  auVar162._4_4_ = auVar104._4_4_ * auVar173._4_4_;
  auVar162._8_4_ = auVar104._8_4_ * auVar173._8_4_;
  auVar162._12_4_ = auVar104._12_4_ * auVar173._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar97 * 0x17 + 6);
  auVar173 = vpmovsxwd_avx(auVar17);
  auVar173 = vcvtdq2ps_avx(auVar173);
  auVar173 = vsubps_avx(auVar173,auVar147);
  auVar103._0_4_ = auVar104._0_4_ * auVar173._0_4_;
  auVar103._4_4_ = auVar104._4_4_ * auVar173._4_4_;
  auVar103._8_4_ = auVar104._8_4_ * auVar173._8_4_;
  auVar103._12_4_ = auVar104._12_4_ * auVar173._12_4_;
  auVar173 = vpminsd_avx(auVar169,auVar185);
  auVar13 = vpminsd_avx(auVar202,auVar126);
  auVar173 = vmaxps_avx(auVar173,auVar13);
  auVar13 = vpminsd_avx(auVar162,auVar103);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar205._4_4_ = uVar4;
  auVar205._0_4_ = uVar4;
  auVar205._8_4_ = uVar4;
  auVar205._12_4_ = uVar4;
  auVar211 = ZEXT1664(auVar205);
  auVar13 = vmaxps_avx(auVar13,auVar205);
  auVar173 = vmaxps_avx(auVar173,auVar13);
  local_160._0_4_ = auVar173._0_4_ * 0.99999964;
  local_160._4_4_ = auVar173._4_4_ * 0.99999964;
  local_160._8_4_ = auVar173._8_4_ * 0.99999964;
  local_160._12_4_ = auVar173._12_4_ * 0.99999964;
  auVar173 = vpmaxsd_avx(auVar169,auVar185);
  auVar13 = vpmaxsd_avx(auVar202,auVar126);
  auVar173 = vminps_avx(auVar173,auVar13);
  auVar13 = vpmaxsd_avx(auVar162,auVar103);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar147._4_4_ = uVar4;
  auVar147._0_4_ = uVar4;
  auVar147._8_4_ = uVar4;
  auVar147._12_4_ = uVar4;
  auVar13 = vminps_avx(auVar13,auVar147);
  auVar173 = vminps_avx(auVar173,auVar13);
  auVar104._0_4_ = auVar173._0_4_ * 1.0000004;
  auVar104._4_4_ = auVar173._4_4_ * 1.0000004;
  auVar104._8_4_ = auVar173._8_4_ * 1.0000004;
  auVar104._12_4_ = auVar173._12_4_ * 1.0000004;
  auVar127[4] = PVar9;
  auVar127._5_3_ = 0;
  auVar127[8] = PVar9;
  auVar127._9_3_ = 0;
  auVar127[0xc] = PVar9;
  auVar127._13_3_ = 0;
  auVar13 = vpcmpgtd_avx(auVar127,_DAT_01ff0cf0);
  auVar173 = vcmpps_avx(local_160,auVar104,2);
  auVar173 = vandps_avx(auVar173,auVar13);
  uVar93 = vmovmskps_avx(auVar173);
  if (uVar93 != 0) {
    uVar93 = uVar93 & 0xff;
    local_500[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_500[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_500[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_500[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_608 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    do {
      auVar138 = auVar211._0_32_;
      auVar113 = auVar217._0_32_;
      lVar21 = 0;
      uVar97 = (ulong)uVar93;
      for (uVar92 = uVar97; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
        lVar21 = lVar21 + 1;
      }
      uVar97 = uVar97 - 1 & uVar97;
      uVar4 = *(undefined4 *)(prim + lVar21 * 4 + 6);
      uVar92 = (ulong)(uint)((int)lVar21 << 6);
      local_7a0._4_4_ = *(undefined4 *)(prim + 2);
      pGVar95 = (context->scene->geometries).items[(uint)local_7a0._4_4_].ptr;
      pPVar1 = prim + uVar92 + lVar74 + 0x16;
      uVar82 = *(undefined8 *)pPVar1;
      uVar83 = *(undefined8 *)(pPVar1 + 8);
      auVar15 = *(undefined1 (*) [16])pPVar1;
      auVar13 = *(undefined1 (*) [16])pPVar1;
      auVar173 = *(undefined1 (*) [16])pPVar1;
      if (uVar97 != 0) {
        uVar94 = uVar97 - 1 & uVar97;
        for (uVar22 = uVar97; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        }
        if (uVar94 != 0) {
          for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_620 = *(undefined1 (*) [16])(prim + uVar92 + lVar74 + 0x26);
      local_630 = *(undefined1 (*) [16])(prim + uVar92 + lVar74 + 0x36);
      _local_640 = *(undefined1 (*) [16])(prim + uVar92 + lVar74 + 0x46);
      iVar10 = (int)pGVar95[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar178 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar104 = vinsertps_avx(auVar178,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar16 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar104);
      uVar98 = auVar16._0_4_;
      auVar170._4_4_ = uVar98;
      auVar170._0_4_ = uVar98;
      auVar170._8_4_ = uVar98;
      auVar170._12_4_ = uVar98;
      auVar178 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      aVar5 = pre->ray_space[k].vx.field_0;
      aVar6 = pre->ray_space[k].vy.field_0;
      fVar146 = pre->ray_space[k].vz.field_0.m128[0];
      fVar145 = pre->ray_space[k].vz.field_0.m128[1];
      fVar117 = pre->ray_space[k].vz.field_0.m128[2];
      fVar119 = pre->ray_space[k].vz.field_0.m128[3];
      auVar191._0_4_ = fVar146 * auVar16._0_4_;
      auVar191._4_4_ = fVar145 * auVar16._4_4_;
      auVar191._8_4_ = fVar117 * auVar16._8_4_;
      auVar191._12_4_ = fVar119 * auVar16._12_4_;
      auVar178 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar6,auVar178);
      auVar147 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar5,auVar170);
      auVar178 = vblendps_avx(auVar147,*(undefined1 (*) [16])pPVar1,8);
      auVar17 = vsubps_avx(local_620,auVar104);
      uVar98 = auVar17._0_4_;
      auVar192._4_4_ = uVar98;
      auVar192._0_4_ = uVar98;
      auVar192._8_4_ = uVar98;
      auVar192._12_4_ = uVar98;
      auVar16 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar206._0_4_ = fVar146 * auVar17._0_4_;
      auVar206._4_4_ = fVar145 * auVar17._4_4_;
      auVar206._8_4_ = fVar117 * auVar17._8_4_;
      auVar206._12_4_ = fVar119 * auVar17._12_4_;
      auVar16 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar6,auVar16);
      auVar126 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar192);
      auVar16 = vblendps_avx(auVar126,local_620,8);
      auVar103 = vsubps_avx(local_630,auVar104);
      uVar98 = auVar103._0_4_;
      auVar198._4_4_ = uVar98;
      auVar198._0_4_ = uVar98;
      auVar198._8_4_ = uVar98;
      auVar198._12_4_ = uVar98;
      auVar17 = vshufps_avx(auVar103,auVar103,0x55);
      auVar103 = vshufps_avx(auVar103,auVar103,0xaa);
      auVar220._0_4_ = fVar146 * auVar103._0_4_;
      auVar220._4_4_ = fVar145 * auVar103._4_4_;
      auVar220._8_4_ = fVar117 * auVar103._8_4_;
      auVar220._12_4_ = fVar119 * auVar103._12_4_;
      auVar17 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar6,auVar17);
      auVar102 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar198);
      auVar17 = vblendps_avx(auVar102,local_630,8);
      auVar103 = vsubps_avx(_local_640,auVar104);
      uVar98 = auVar103._0_4_;
      auVar199._4_4_ = uVar98;
      auVar199._0_4_ = uVar98;
      auVar199._8_4_ = uVar98;
      auVar199._12_4_ = uVar98;
      auVar104 = vshufps_avx(auVar103,auVar103,0x55);
      auVar103 = vshufps_avx(auVar103,auVar103,0xaa);
      auVar224._0_4_ = fVar146 * auVar103._0_4_;
      auVar224._4_4_ = fVar145 * auVar103._4_4_;
      auVar224._8_4_ = fVar117 * auVar103._8_4_;
      auVar224._12_4_ = fVar119 * auVar103._12_4_;
      auVar104 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar6,auVar104);
      auVar127 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar5,auVar199);
      auVar104 = vblendps_avx(auVar127,_local_640,8);
      auVar178 = vandps_avx(auVar178,local_150);
      auVar16 = vandps_avx(auVar16,local_150);
      auVar103 = vmaxps_avx(auVar178,auVar16);
      auVar178 = vandps_avx(auVar17,local_150);
      auVar16 = vandps_avx(auVar104,local_150);
      auVar178 = vmaxps_avx(auVar178,auVar16);
      auVar178 = vmaxps_avx(auVar103,auVar178);
      auVar16 = vmovshdup_avx(auVar178);
      auVar16 = vmaxss_avx(auVar16,auVar178);
      auVar178 = vshufpd_avx(auVar178,auVar178,1);
      auVar178 = vmaxss_avx(auVar178,auVar16);
      lVar21 = (long)iVar10 * 0x44;
      auVar16 = vmovshdup_avx(auVar147);
      uVar100 = auVar16._0_8_;
      local_400._8_8_ = uVar100;
      local_400._0_8_ = uVar100;
      local_400._16_8_ = uVar100;
      local_400._24_8_ = uVar100;
      auVar16 = vmovshdup_avx(auVar126);
      uVar100 = auVar16._0_8_;
      local_5c0._8_8_ = uVar100;
      local_5c0._0_8_ = uVar100;
      local_5c0._16_8_ = uVar100;
      local_5c0._24_8_ = uVar100;
      auVar190 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x908);
      uVar218 = auVar102._0_4_;
      local_5a0._4_4_ = uVar218;
      local_5a0._0_4_ = uVar218;
      local_5a0._8_4_ = uVar218;
      local_5a0._12_4_ = uVar218;
      local_5a0._16_4_ = uVar218;
      local_5a0._20_4_ = uVar218;
      local_5a0._24_4_ = uVar218;
      local_5a0._28_4_ = uVar218;
      auVar16 = vmovshdup_avx(auVar102);
      uVar100 = auVar16._0_8_;
      auVar193._8_8_ = uVar100;
      auVar193._0_8_ = uVar100;
      auVar193._16_8_ = uVar100;
      auVar193._24_8_ = uVar100;
      fVar146 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar21 + 0xd8c);
      auVar90 = *(undefined1 (*) [28])(bspline_basis0 + lVar21 + 0xd8c);
      local_660 = auVar127._0_4_;
      auVar16 = vmovshdup_avx(auVar127);
      local_6c0 = auVar16._0_8_;
      auVar136._4_4_ = local_660 * *(float *)(bspline_basis0 + lVar21 + 0xd90);
      auVar136._0_4_ = local_660 * fVar146;
      auVar136._8_4_ = local_660 * *(float *)(bspline_basis0 + lVar21 + 0xd94);
      auVar136._12_4_ = local_660 * *(float *)(bspline_basis0 + lVar21 + 0xd98);
      auVar136._16_4_ = local_660 * *(float *)(bspline_basis0 + lVar21 + 0xd9c);
      auVar136._20_4_ = local_660 * *(float *)(bspline_basis0 + lVar21 + 0xda0);
      auVar136._24_4_ = local_660 * *(float *)(bspline_basis0 + lVar21 + 0xda4);
      auVar136._28_4_ = *(undefined4 *)(bspline_basis0 + lVar21 + 0xda8);
      auVar17 = vfmadd231ps_fma(auVar136,auVar190,local_5a0);
      fVar161 = auVar16._0_4_;
      auVar229._0_4_ = fVar161 * fVar146;
      fVar167 = auVar16._4_4_;
      auVar229._4_4_ = fVar167 * *(float *)(bspline_basis0 + lVar21 + 0xd90);
      auVar229._8_4_ = fVar161 * *(float *)(bspline_basis0 + lVar21 + 0xd94);
      auVar229._12_4_ = fVar167 * *(float *)(bspline_basis0 + lVar21 + 0xd98);
      auVar229._16_4_ = fVar161 * *(float *)(bspline_basis0 + lVar21 + 0xd9c);
      auVar229._20_4_ = fVar167 * *(float *)(bspline_basis0 + lVar21 + 0xda0);
      auVar229._24_4_ = fVar161 * *(float *)(bspline_basis0 + lVar21 + 0xda4);
      auVar229._28_4_ = 0;
      auVar16 = vfmadd231ps_fma(auVar229,auVar190,auVar193);
      auVar136 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x484);
      uVar98 = auVar126._0_4_;
      local_6a0._4_4_ = uVar98;
      local_6a0._0_4_ = uVar98;
      local_6a0._8_4_ = uVar98;
      local_6a0._12_4_ = uVar98;
      local_6a0._16_4_ = uVar98;
      local_6a0._20_4_ = uVar98;
      local_6a0._24_4_ = uVar98;
      local_6a0._28_4_ = uVar98;
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar136,local_6a0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar136,local_5c0);
      auVar229 = *(undefined1 (*) [32])(bspline_basis0 + lVar21);
      local_460._0_4_ = auVar147._0_4_;
      local_720._4_4_ = local_460._0_4_;
      local_720._0_4_ = local_460._0_4_;
      local_720._8_4_ = local_460._0_4_;
      local_720._12_4_ = local_460._0_4_;
      local_720._16_4_ = local_460._0_4_;
      local_720._20_4_ = local_460._0_4_;
      local_720._24_4_ = local_460._0_4_;
      local_720._28_4_ = local_460._0_4_;
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar229,local_720);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar229,local_400);
      auVar7 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x908);
      fVar116 = *(float *)(bspline_basis1 + lVar21 + 0xd8c);
      fVar118 = *(float *)(bspline_basis1 + lVar21 + 0xd90);
      fVar120 = *(float *)(bspline_basis1 + lVar21 + 0xd94);
      fVar121 = *(float *)(bspline_basis1 + lVar21 + 0xd98);
      fVar122 = *(float *)(bspline_basis1 + lVar21 + 0xd9c);
      fVar123 = *(float *)(bspline_basis1 + lVar21 + 0xda0);
      fVar160 = *(float *)(bspline_basis1 + lVar21 + 0xda4);
      auVar8._4_4_ = fVar118 * local_660;
      auVar8._0_4_ = fVar116 * local_660;
      auVar8._8_4_ = fVar120 * local_660;
      auVar8._12_4_ = fVar121 * local_660;
      auVar8._16_4_ = fVar122 * local_660;
      auVar8._20_4_ = fVar123 * local_660;
      auVar8._24_4_ = fVar160 * local_660;
      auVar8._28_4_ = *(undefined4 *)(bspline_basis0 + lVar21 + 0xda8);
      auVar104 = vfmadd231ps_fma(auVar8,auVar7,local_5a0);
      auVar210._4_4_ = fVar118 * fVar167;
      auVar210._0_4_ = fVar116 * fVar161;
      auVar210._8_4_ = fVar120 * fVar161;
      auVar210._12_4_ = fVar121 * fVar167;
      auVar210._16_4_ = fVar122 * fVar161;
      auVar210._20_4_ = fVar123 * fVar167;
      auVar210._24_4_ = fVar160 * fVar161;
      auVar210._28_4_ = uVar218;
      auVar103 = vfmadd231ps_fma(auVar210,auVar7,auVar193);
      auVar8 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x484);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar8,local_6a0);
      auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar8,local_5c0);
      auVar210 = *(undefined1 (*) [32])(bspline_basis1 + lVar21);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar210,local_720);
      auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar210,local_400);
      auVar106 = ZEXT1632(auVar104);
      auVar131 = ZEXT1632(auVar17);
      auVar164 = vsubps_avx(auVar106,auVar131);
      auVar156 = ZEXT1632(auVar103);
      local_1a0 = ZEXT1632(auVar16);
      local_1c0 = vsubps_avx(auVar156,local_1a0);
      auVar107._0_4_ = auVar16._0_4_ * auVar164._0_4_;
      auVar107._4_4_ = auVar16._4_4_ * auVar164._4_4_;
      auVar107._8_4_ = auVar16._8_4_ * auVar164._8_4_;
      auVar107._12_4_ = auVar16._12_4_ * auVar164._12_4_;
      auVar107._16_4_ = auVar164._16_4_ * 0.0;
      auVar107._20_4_ = auVar164._20_4_ * 0.0;
      auVar107._24_4_ = auVar164._24_4_ * 0.0;
      auVar107._28_4_ = 0;
      fVar146 = local_1c0._0_4_;
      auVar132._0_4_ = auVar17._0_4_ * fVar146;
      fVar145 = local_1c0._4_4_;
      auVar132._4_4_ = auVar17._4_4_ * fVar145;
      fVar117 = local_1c0._8_4_;
      auVar132._8_4_ = auVar17._8_4_ * fVar117;
      fVar119 = local_1c0._12_4_;
      auVar132._12_4_ = auVar17._12_4_ * fVar119;
      fVar234 = local_1c0._16_4_;
      auVar132._16_4_ = fVar234 * 0.0;
      fVar235 = local_1c0._20_4_;
      auVar132._20_4_ = fVar235 * 0.0;
      fVar99 = local_1c0._24_4_;
      auVar132._24_4_ = fVar99 * 0.0;
      auVar132._28_4_ = 0;
      auVar107 = vsubps_avx(auVar107,auVar132);
      auVar16 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar100 = auVar16._0_8_;
      local_80._8_8_ = uVar100;
      local_80._0_8_ = uVar100;
      local_80._16_8_ = uVar100;
      local_80._24_8_ = uVar100;
      auVar17 = vpermilps_avx(local_620,0xff);
      uVar100 = auVar17._0_8_;
      local_a0._8_8_ = uVar100;
      local_a0._0_8_ = uVar100;
      local_a0._16_8_ = uVar100;
      local_a0._24_8_ = uVar100;
      auVar17 = vpermilps_avx(local_630,0xff);
      uVar100 = auVar17._0_8_;
      local_c0._8_8_ = uVar100;
      local_c0._0_8_ = uVar100;
      local_c0._16_8_ = uVar100;
      local_c0._24_8_ = uVar100;
      auVar17 = vpermilps_avx(_local_640,0xff);
      local_e0 = auVar17._0_8_;
      local_7c0 = auVar90._0_4_;
      fStack_7bc = auVar90._4_4_;
      fStack_7b8 = auVar90._8_4_;
      fStack_7b4 = auVar90._12_4_;
      fStack_7b0 = auVar90._16_4_;
      fStack_7ac = auVar90._20_4_;
      fStack_7a8 = auVar90._24_4_;
      fVar124 = auVar17._0_4_;
      fVar144 = auVar17._4_4_;
      auVar14._4_4_ = fVar144 * fStack_7bc;
      auVar14._0_4_ = fVar124 * local_7c0;
      auVar14._8_4_ = fVar124 * fStack_7b8;
      auVar14._12_4_ = fVar144 * fStack_7b4;
      auVar14._16_4_ = fVar124 * fStack_7b0;
      auVar14._20_4_ = fVar144 * fStack_7ac;
      auVar14._24_4_ = fVar124 * fStack_7a8;
      auVar14._28_4_ = local_460._0_4_;
      auVar17 = vfmadd231ps_fma(auVar14,local_c0,auVar190);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar136,local_a0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar229,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar222._4_4_ = fVar118 * fVar144;
      auVar222._0_4_ = fVar116 * fVar124;
      auVar222._8_4_ = fVar120 * fVar124;
      auVar222._12_4_ = fVar121 * fVar144;
      auVar222._16_4_ = fVar122 * fVar124;
      auVar222._20_4_ = fVar123 * fVar144;
      auVar222._24_4_ = fVar160 * fVar124;
      auVar222._28_4_ = auVar229._28_4_;
      auVar104 = vfmadd231ps_fma(auVar222,auVar7,local_c0);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar8,local_a0);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar210,local_80);
      auVar18._4_4_ = fVar145 * fVar145;
      auVar18._0_4_ = fVar146 * fVar146;
      auVar18._8_4_ = fVar117 * fVar117;
      auVar18._12_4_ = fVar119 * fVar119;
      auVar18._16_4_ = fVar234 * fVar234;
      auVar18._20_4_ = fVar235 * fVar235;
      auVar18._24_4_ = fVar99 * fVar99;
      auVar18._28_4_ = auVar16._4_4_;
      auVar16 = vfmadd231ps_fma(auVar18,auVar164,auVar164);
      auVar14 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar104));
      auVar19._4_4_ = auVar14._4_4_ * auVar14._4_4_ * auVar16._4_4_;
      auVar19._0_4_ = auVar14._0_4_ * auVar14._0_4_ * auVar16._0_4_;
      auVar19._8_4_ = auVar14._8_4_ * auVar14._8_4_ * auVar16._8_4_;
      auVar19._12_4_ = auVar14._12_4_ * auVar14._12_4_ * auVar16._12_4_;
      auVar19._16_4_ = auVar14._16_4_ * auVar14._16_4_ * 0.0;
      auVar19._20_4_ = auVar14._20_4_ * auVar14._20_4_ * 0.0;
      auVar19._24_4_ = auVar14._24_4_ * auVar14._24_4_ * 0.0;
      auVar19._28_4_ = auVar14._28_4_;
      auVar20._4_4_ = auVar107._4_4_ * auVar107._4_4_;
      auVar20._0_4_ = auVar107._0_4_ * auVar107._0_4_;
      auVar20._8_4_ = auVar107._8_4_ * auVar107._8_4_;
      auVar20._12_4_ = auVar107._12_4_ * auVar107._12_4_;
      auVar20._16_4_ = auVar107._16_4_ * auVar107._16_4_;
      auVar20._20_4_ = auVar107._20_4_ * auVar107._20_4_;
      auVar20._24_4_ = auVar107._24_4_ * auVar107._24_4_;
      auVar20._28_4_ = auVar107._28_4_;
      auVar14 = vcmpps_avx(auVar20,auVar19,2);
      fVar146 = auVar178._0_4_ * 4.7683716e-07;
      auVar108._0_4_ = (float)iVar10;
      _auStack_41c = auVar127._4_12_;
      auVar108._4_4_ = auVar108._0_4_;
      auVar108._8_4_ = auVar108._0_4_;
      auVar108._12_4_ = auVar108._0_4_;
      auVar108._16_4_ = auVar108._0_4_;
      auVar108._20_4_ = auVar108._0_4_;
      auVar108._24_4_ = auVar108._0_4_;
      auVar108._28_4_ = auVar108._0_4_;
      auVar107 = vcmpps_avx(_DAT_02020f40,auVar108,1);
      auVar16 = vpermilps_avx(auVar147,0xaa);
      uVar100 = auVar16._0_8_;
      auVar163._8_8_ = uVar100;
      auVar163._0_8_ = uVar100;
      auVar163._16_8_ = uVar100;
      auVar163._24_8_ = uVar100;
      auVar166 = ZEXT3264(auVar163);
      auVar178 = vpermilps_avx(auVar126,0xaa);
      uVar100 = auVar178._0_8_;
      local_100._8_8_ = uVar100;
      local_100._0_8_ = uVar100;
      local_100._16_8_ = uVar100;
      local_100._24_8_ = uVar100;
      auVar178 = vpermilps_avx(auVar102,0xaa);
      uVar100 = auVar178._0_8_;
      local_460._8_8_ = uVar100;
      local_460._0_8_ = uVar100;
      local_460._16_8_ = uVar100;
      local_460._24_8_ = uVar100;
      auVar178 = vshufps_avx(auVar127,auVar127,0xaa);
      uVar100 = auVar178._0_8_;
      register0x00001508 = uVar100;
      local_680 = uVar100;
      register0x00001510 = uVar100;
      register0x00001518 = uVar100;
      auVar227 = ZEXT3264(_local_680);
      auVar222 = auVar107 & auVar14;
      uVar93 = *(uint *)(ray + k * 4 + 0x30);
      _local_520 = ZEXT416(uVar93);
      fVar145 = fVar161;
      fVar117 = fVar167;
      fVar119 = fVar161;
      fVar234 = fVar167;
      fVar235 = fVar161;
      local_760 = auVar193;
      uStack_6b8 = local_6c0;
      uStack_6b0 = local_6c0;
      uStack_6a8 = local_6c0;
      fStack_65c = local_660;
      fStack_658 = local_660;
      fStack_654 = local_660;
      fStack_650 = local_660;
      fStack_64c = local_660;
      fStack_648 = local_660;
      fStack_644 = local_660;
      local_420 = auVar108._0_4_;
      if ((((((((auVar222 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar222 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar222 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar222 >> 0x7f,0) == '\0') &&
            (auVar222 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar222 >> 0xbf,0) == '\0') &&
          (auVar222 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar222[0x1f]) {
        auVar217 = ZEXT3264(auVar113);
        auVar211 = ZEXT3264(auVar138);
        auVar143 = ZEXT3264(local_5c0);
        auVar204 = ZEXT3264(auVar193);
        auVar200 = ZEXT3264(local_6a0);
        auVar195 = ZEXT3264(local_720);
      }
      else {
        local_4c0 = SUB84(pGVar95,0);
        fStack_4bc = (float)((ulong)pGVar95 >> 0x20);
        auVar14 = vandps_avx(auVar14,auVar107);
        fVar124 = auVar178._0_4_;
        fVar144 = auVar178._4_4_;
        auVar232._4_4_ = fVar144 * fVar118;
        auVar232._0_4_ = fVar124 * fVar116;
        auVar232._8_4_ = fVar124 * fVar120;
        auVar232._12_4_ = fVar144 * fVar121;
        auVar232._16_4_ = fVar124 * fVar122;
        auVar232._20_4_ = fVar144 * fVar123;
        auVar232._24_4_ = fVar124 * fVar160;
        auVar232._28_4_ = auVar14._28_4_;
        auVar178 = vfmadd213ps_fma(auVar7,local_460,auVar232);
        auVar178 = vfmadd213ps_fma(auVar8,local_100,ZEXT1632(auVar178));
        auVar178 = vfmadd213ps_fma(auVar210,auVar163,ZEXT1632(auVar178));
        auVar109._0_4_ = fVar124 * local_7c0;
        auVar109._4_4_ = fVar144 * fStack_7bc;
        auVar109._8_4_ = fVar124 * fStack_7b8;
        auVar109._12_4_ = fVar144 * fStack_7b4;
        auVar109._16_4_ = fVar124 * fStack_7b0;
        auVar109._20_4_ = fVar144 * fStack_7ac;
        auVar109._24_4_ = fVar124 * fStack_7a8;
        auVar109._28_4_ = 0;
        auVar103 = vfmadd213ps_fma(auVar190,local_460,auVar109);
        auVar103 = vfmadd213ps_fma(auVar136,local_100,ZEXT1632(auVar103));
        auVar190 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1210);
        auVar136 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1694);
        auVar7 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1b18);
        fVar99 = *(float *)(bspline_basis0 + lVar21 + 0x1f9c);
        fVar116 = *(float *)(bspline_basis0 + lVar21 + 0x1fa0);
        fVar118 = *(float *)(bspline_basis0 + lVar21 + 0x1fa4);
        fVar120 = *(float *)(bspline_basis0 + lVar21 + 0x1fa8);
        fVar121 = *(float *)(bspline_basis0 + lVar21 + 0x1fac);
        fVar122 = *(float *)(bspline_basis0 + lVar21 + 0x1fb0);
        fVar123 = *(float *)(bspline_basis0 + lVar21 + 0x1fb4);
        auVar186._0_4_ = local_660 * fVar99;
        auVar186._4_4_ = local_660 * fVar116;
        auVar186._8_4_ = local_660 * fVar118;
        auVar186._12_4_ = local_660 * fVar120;
        auVar186._16_4_ = local_660 * fVar121;
        auVar186._20_4_ = local_660 * fVar122;
        auVar186._24_4_ = local_660 * fVar123;
        auVar186._28_4_ = 0;
        auVar23._4_4_ = fVar167 * fVar116;
        auVar23._0_4_ = fVar161 * fVar99;
        auVar23._8_4_ = fVar161 * fVar118;
        auVar23._12_4_ = fVar167 * fVar120;
        auVar23._16_4_ = fVar161 * fVar121;
        auVar23._20_4_ = fVar167 * fVar122;
        auVar23._24_4_ = fVar161 * fVar123;
        auVar23._28_4_ = *(undefined4 *)(bspline_basis1 + lVar21 + 0xda8);
        auVar24._4_4_ = fVar116 * fVar144;
        auVar24._0_4_ = fVar99 * fVar124;
        auVar24._8_4_ = fVar118 * fVar124;
        auVar24._12_4_ = fVar120 * fVar144;
        auVar24._16_4_ = fVar121 * fVar124;
        auVar24._20_4_ = fVar122 * fVar144;
        auVar24._24_4_ = fVar123 * fVar124;
        auVar24._28_4_ = auVar164._28_4_;
        auVar147 = vfmadd231ps_fma(auVar186,auVar7,local_5a0);
        auVar126 = vfmadd231ps_fma(auVar23,auVar7,auVar193);
        auVar102 = vfmadd231ps_fma(auVar24,local_460,auVar7);
        auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar136,local_6a0);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar136,local_5c0);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),local_100,auVar136);
        auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar190,local_720);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar190,local_400);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar163,auVar190);
        fVar99 = *(float *)(bspline_basis1 + lVar21 + 0x1f9c);
        fVar116 = *(float *)(bspline_basis1 + lVar21 + 0x1fa0);
        fVar118 = *(float *)(bspline_basis1 + lVar21 + 0x1fa4);
        fVar120 = *(float *)(bspline_basis1 + lVar21 + 0x1fa8);
        fVar121 = *(float *)(bspline_basis1 + lVar21 + 0x1fac);
        fVar122 = *(float *)(bspline_basis1 + lVar21 + 0x1fb0);
        fVar123 = *(float *)(bspline_basis1 + lVar21 + 0x1fb4);
        auVar7._4_4_ = local_660 * fVar116;
        auVar7._0_4_ = local_660 * fVar99;
        auVar7._8_4_ = local_660 * fVar118;
        auVar7._12_4_ = local_660 * fVar120;
        auVar7._16_4_ = local_660 * fVar121;
        auVar7._20_4_ = local_660 * fVar122;
        auVar7._24_4_ = local_660 * fVar123;
        auVar7._28_4_ = local_660;
        auVar25._4_4_ = fVar167 * fVar116;
        auVar25._0_4_ = fVar161 * fVar99;
        auVar25._8_4_ = fVar161 * fVar118;
        auVar25._12_4_ = fVar167 * fVar120;
        auVar25._16_4_ = fVar161 * fVar121;
        auVar25._20_4_ = fVar167 * fVar122;
        auVar25._24_4_ = fVar161 * fVar123;
        auVar25._28_4_ = fVar167;
        auVar26._4_4_ = fVar116 * fVar144;
        auVar26._0_4_ = fVar99 * fVar124;
        auVar26._8_4_ = fVar118 * fVar124;
        auVar26._12_4_ = fVar120 * fVar144;
        auVar26._16_4_ = fVar121 * fVar124;
        auVar26._20_4_ = fVar122 * fVar144;
        auVar26._24_4_ = fVar123 * fVar124;
        auVar26._28_4_ = auVar16._4_4_;
        auVar190 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1b18);
        auVar16 = vfmadd231ps_fma(auVar7,auVar190,local_5a0);
        auVar127 = vfmadd231ps_fma(auVar25,auVar190,auVar193);
        auVar162 = vfmadd231ps_fma(auVar26,auVar190,local_460);
        auVar190 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1694);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar190,local_6a0);
        auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar190,local_5c0);
        auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),local_100,auVar190);
        auVar190 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1210);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar190,local_720);
        auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar190,local_400);
        auVar133._8_4_ = 0x7fffffff;
        auVar133._0_8_ = 0x7fffffff7fffffff;
        auVar133._12_4_ = 0x7fffffff;
        auVar133._16_4_ = 0x7fffffff;
        auVar133._20_4_ = 0x7fffffff;
        auVar133._24_4_ = 0x7fffffff;
        auVar133._28_4_ = 0x7fffffff;
        auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar163,auVar190);
        auVar190 = vandps_avx(ZEXT1632(auVar147),auVar133);
        auVar136 = vandps_avx(ZEXT1632(auVar126),auVar133);
        auVar136 = vmaxps_avx(auVar190,auVar136);
        auVar190 = vandps_avx(ZEXT1632(auVar102),auVar133);
        auVar190 = vmaxps_avx(auVar136,auVar190);
        auVar157._4_4_ = fVar146;
        auVar157._0_4_ = fVar146;
        auVar157._8_4_ = fVar146;
        auVar157._12_4_ = fVar146;
        auVar157._16_4_ = fVar146;
        auVar157._20_4_ = fVar146;
        auVar157._24_4_ = fVar146;
        auVar157._28_4_ = fVar146;
        auVar190 = vcmpps_avx(auVar190,auVar157,1);
        auVar7 = vblendvps_avx(ZEXT1632(auVar147),auVar164,auVar190);
        auVar8 = vblendvps_avx(ZEXT1632(auVar126),local_1c0,auVar190);
        auVar190 = vandps_avx(ZEXT1632(auVar16),auVar133);
        auVar136 = vandps_avx(ZEXT1632(auVar127),auVar133);
        auVar210 = vmaxps_avx(auVar190,auVar136);
        auVar190 = vandps_avx(ZEXT1632(auVar162),auVar133);
        auVar190 = vmaxps_avx(auVar210,auVar190);
        auVar107 = vcmpps_avx(auVar190,auVar157,1);
        auVar190 = vblendvps_avx(ZEXT1632(auVar16),auVar164,auVar107);
        auVar210 = vblendvps_avx(ZEXT1632(auVar127),local_1c0,auVar107);
        auVar16 = vfmadd213ps_fma(auVar229,auVar163,ZEXT1632(auVar103));
        auVar103 = vfmadd213ps_fma(auVar7,auVar7,ZEXT832(0) << 0x20);
        auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar8,auVar8);
        auVar229 = vrsqrtps_avx(ZEXT1632(auVar103));
        fVar99 = auVar229._0_4_;
        fVar116 = auVar229._4_4_;
        fVar118 = auVar229._8_4_;
        fVar120 = auVar229._12_4_;
        fVar121 = auVar229._16_4_;
        fVar122 = auVar229._20_4_;
        fVar123 = auVar229._24_4_;
        auVar164._4_4_ = fVar116 * fVar116 * fVar116 * auVar103._4_4_ * -0.5;
        auVar164._0_4_ = fVar99 * fVar99 * fVar99 * auVar103._0_4_ * -0.5;
        auVar164._8_4_ = fVar118 * fVar118 * fVar118 * auVar103._8_4_ * -0.5;
        auVar164._12_4_ = fVar120 * fVar120 * fVar120 * auVar103._12_4_ * -0.5;
        auVar164._16_4_ = fVar121 * fVar121 * fVar121 * -0.0;
        auVar164._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar164._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar164._28_4_ = 0;
        auVar181._8_4_ = 0x3fc00000;
        auVar181._0_8_ = 0x3fc000003fc00000;
        auVar181._12_4_ = 0x3fc00000;
        auVar181._16_4_ = 0x3fc00000;
        auVar181._20_4_ = 0x3fc00000;
        auVar181._24_4_ = 0x3fc00000;
        auVar181._28_4_ = 0x3fc00000;
        auVar103 = vfmadd231ps_fma(auVar164,auVar181,auVar229);
        fVar99 = auVar103._0_4_;
        fVar116 = auVar103._4_4_;
        auVar27._4_4_ = auVar8._4_4_ * fVar116;
        auVar27._0_4_ = auVar8._0_4_ * fVar99;
        fVar118 = auVar103._8_4_;
        auVar27._8_4_ = auVar8._8_4_ * fVar118;
        fVar120 = auVar103._12_4_;
        auVar27._12_4_ = auVar8._12_4_ * fVar120;
        auVar27._16_4_ = auVar8._16_4_ * 0.0;
        auVar27._20_4_ = auVar8._20_4_ * 0.0;
        auVar27._24_4_ = auVar8._24_4_ * 0.0;
        auVar27._28_4_ = auVar229._28_4_;
        auVar28._4_4_ = -auVar7._4_4_ * fVar116;
        auVar28._0_4_ = -auVar7._0_4_ * fVar99;
        auVar28._8_4_ = -auVar7._8_4_ * fVar118;
        auVar28._12_4_ = -auVar7._12_4_ * fVar120;
        auVar28._16_4_ = -auVar7._16_4_ * 0.0;
        auVar28._20_4_ = -auVar7._20_4_ * 0.0;
        auVar28._24_4_ = -auVar7._24_4_ * 0.0;
        auVar28._28_4_ = auVar136._28_4_;
        auVar103 = vfmadd213ps_fma(auVar190,auVar190,ZEXT832(0) << 0x20);
        auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar210,auVar210);
        auVar136 = vrsqrtps_avx(ZEXT1632(auVar103));
        auVar29._28_4_ = auVar107._28_4_;
        auVar29._0_28_ =
             ZEXT1628(CONCAT412(fVar120 * 0.0,
                                CONCAT48(fVar118 * 0.0,CONCAT44(fVar116 * 0.0,fVar99 * 0.0))));
        fVar99 = auVar136._0_4_;
        fVar116 = auVar136._4_4_;
        fVar118 = auVar136._8_4_;
        fVar120 = auVar136._12_4_;
        fVar121 = auVar136._16_4_;
        fVar122 = auVar136._20_4_;
        fVar123 = auVar136._24_4_;
        auVar30._4_4_ = fVar116 * fVar116 * fVar116 * auVar103._4_4_ * -0.5;
        auVar30._0_4_ = fVar99 * fVar99 * fVar99 * auVar103._0_4_ * -0.5;
        auVar30._8_4_ = fVar118 * fVar118 * fVar118 * auVar103._8_4_ * -0.5;
        auVar30._12_4_ = fVar120 * fVar120 * fVar120 * auVar103._12_4_ * -0.5;
        auVar30._16_4_ = fVar121 * fVar121 * fVar121 * -0.0;
        auVar30._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar30._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar30._28_4_ = 0;
        auVar103 = vfmadd231ps_fma(auVar30,auVar181,auVar136);
        fVar99 = auVar103._0_4_;
        fVar116 = auVar103._4_4_;
        auVar31._4_4_ = auVar210._4_4_ * fVar116;
        auVar31._0_4_ = auVar210._0_4_ * fVar99;
        fVar118 = auVar103._8_4_;
        auVar31._8_4_ = auVar210._8_4_ * fVar118;
        fVar120 = auVar103._12_4_;
        auVar31._12_4_ = auVar210._12_4_ * fVar120;
        auVar31._16_4_ = auVar210._16_4_ * 0.0;
        auVar31._20_4_ = auVar210._20_4_ * 0.0;
        auVar31._24_4_ = auVar210._24_4_ * 0.0;
        auVar31._28_4_ = 0;
        auVar32._4_4_ = -auVar190._4_4_ * fVar116;
        auVar32._0_4_ = -auVar190._0_4_ * fVar99;
        auVar32._8_4_ = -auVar190._8_4_ * fVar118;
        auVar32._12_4_ = -auVar190._12_4_ * fVar120;
        auVar32._16_4_ = -auVar190._16_4_ * 0.0;
        auVar32._20_4_ = -auVar190._20_4_ * 0.0;
        auVar32._24_4_ = -auVar190._24_4_ * 0.0;
        auVar32._28_4_ = auVar210._28_4_;
        auVar190._28_4_ = auVar136._28_4_;
        auVar190._0_28_ =
             ZEXT1628(CONCAT412(fVar120 * 0.0,
                                CONCAT48(fVar118 * 0.0,CONCAT44(fVar116 * 0.0,fVar99 * 0.0))));
        auVar103 = vfmadd213ps_fma(auVar27,ZEXT1632(auVar17),auVar131);
        auVar136 = ZEXT1632(auVar17);
        auVar147 = vfmadd213ps_fma(auVar28,auVar136,local_1a0);
        auVar126 = vfmadd213ps_fma(auVar29,auVar136,ZEXT1632(auVar16));
        auVar162 = vfnmadd213ps_fma(auVar27,auVar136,auVar131);
        auVar102 = vfmadd213ps_fma(auVar31,ZEXT1632(auVar104),auVar106);
        auVar169 = vfnmadd213ps_fma(auVar28,auVar136,local_1a0);
        auVar136 = ZEXT1632(auVar104);
        auVar127 = vfmadd213ps_fma(auVar32,auVar136,auVar156);
        auVar232 = ZEXT1632(auVar17);
        auVar168 = vfnmadd231ps_fma(ZEXT1632(auVar16),auVar232,auVar29);
        auVar16 = vfmadd213ps_fma(auVar190,auVar136,ZEXT1632(auVar178));
        auVar101 = vfnmadd213ps_fma(auVar31,auVar136,auVar106);
        auVar125 = vfnmadd213ps_fma(auVar32,auVar136,auVar156);
        auVar183 = vfnmadd231ps_fma(ZEXT1632(auVar178),ZEXT1632(auVar104),auVar190);
        auVar190 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar169));
        auVar136 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar168));
        auVar106._4_4_ = auVar168._4_4_ * auVar190._4_4_;
        auVar106._0_4_ = auVar168._0_4_ * auVar190._0_4_;
        auVar106._8_4_ = auVar168._8_4_ * auVar190._8_4_;
        auVar106._12_4_ = auVar168._12_4_ * auVar190._12_4_;
        auVar106._16_4_ = auVar190._16_4_ * 0.0;
        auVar106._20_4_ = auVar190._20_4_ * 0.0;
        auVar106._24_4_ = auVar190._24_4_ * 0.0;
        auVar106._28_4_ = 0;
        auVar17 = vfmsub231ps_fma(auVar106,ZEXT1632(auVar169),auVar136);
        auVar131._4_4_ = auVar162._4_4_ * auVar136._4_4_;
        auVar131._0_4_ = auVar162._0_4_ * auVar136._0_4_;
        auVar131._8_4_ = auVar162._8_4_ * auVar136._8_4_;
        auVar131._12_4_ = auVar162._12_4_ * auVar136._12_4_;
        auVar131._16_4_ = auVar136._16_4_ * 0.0;
        auVar131._20_4_ = auVar136._20_4_ * 0.0;
        auVar131._24_4_ = auVar136._24_4_ * 0.0;
        auVar131._28_4_ = auVar136._28_4_;
        auVar107 = ZEXT1632(auVar162);
        auVar136 = vsubps_avx(ZEXT1632(auVar102),auVar107);
        auVar178 = vfmsub231ps_fma(auVar131,ZEXT1632(auVar168),auVar136);
        auVar156._4_4_ = auVar169._4_4_ * auVar136._4_4_;
        auVar156._0_4_ = auVar169._0_4_ * auVar136._0_4_;
        auVar156._8_4_ = auVar169._8_4_ * auVar136._8_4_;
        auVar156._12_4_ = auVar169._12_4_ * auVar136._12_4_;
        auVar156._16_4_ = auVar136._16_4_ * 0.0;
        auVar156._20_4_ = auVar136._20_4_ * 0.0;
        auVar156._24_4_ = auVar136._24_4_ * 0.0;
        auVar156._28_4_ = auVar136._28_4_;
        auVar162 = vfmsub231ps_fma(auVar156,auVar107,auVar190);
        auVar178 = vfmadd231ps_fma(ZEXT1632(auVar162),ZEXT832(0) << 0x20,ZEXT1632(auVar178));
        auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar18 = vcmpps_avx(ZEXT1632(auVar178),ZEXT832(0) << 0x20,2);
        auVar166 = ZEXT3264(auVar18);
        auVar190 = vblendvps_avx(ZEXT1632(auVar101),ZEXT1632(auVar103),auVar18);
        auVar136 = vblendvps_avx(ZEXT1632(auVar125),ZEXT1632(auVar147),auVar18);
        auVar229 = vblendvps_avx(ZEXT1632(auVar183),ZEXT1632(auVar126),auVar18);
        auVar7 = vblendvps_avx(auVar107,ZEXT1632(auVar102),auVar18);
        auVar8 = vblendvps_avx(ZEXT1632(auVar169),ZEXT1632(auVar127),auVar18);
        auVar210 = vblendvps_avx(ZEXT1632(auVar168),ZEXT1632(auVar16),auVar18);
        auVar107 = vblendvps_avx(ZEXT1632(auVar102),auVar107,auVar18);
        auVar164 = vblendvps_avx(ZEXT1632(auVar127),ZEXT1632(auVar169),auVar18);
        auVar178 = vpackssdw_avx(auVar14._0_16_,auVar14._16_16_);
        auVar222 = vblendvps_avx(ZEXT1632(auVar16),ZEXT1632(auVar168),auVar18);
        auVar19 = vsubps_avx(auVar107,auVar190);
        auVar164 = vsubps_avx(auVar164,auVar136);
        auVar20 = vsubps_avx(auVar222,auVar229);
        auVar106 = vsubps_avx(auVar190,auVar7);
        auVar131 = vsubps_avx(auVar136,auVar8);
        auVar132 = vsubps_avx(auVar229,auVar210);
        auVar33._4_4_ = auVar20._4_4_ * auVar190._4_4_;
        auVar33._0_4_ = auVar20._0_4_ * auVar190._0_4_;
        auVar33._8_4_ = auVar20._8_4_ * auVar190._8_4_;
        auVar33._12_4_ = auVar20._12_4_ * auVar190._12_4_;
        auVar33._16_4_ = auVar20._16_4_ * auVar190._16_4_;
        auVar33._20_4_ = auVar20._20_4_ * auVar190._20_4_;
        auVar33._24_4_ = auVar20._24_4_ * auVar190._24_4_;
        auVar33._28_4_ = auVar222._28_4_;
        auVar16 = vfmsub231ps_fma(auVar33,auVar229,auVar19);
        auVar34._4_4_ = auVar19._4_4_ * auVar136._4_4_;
        auVar34._0_4_ = auVar19._0_4_ * auVar136._0_4_;
        auVar34._8_4_ = auVar19._8_4_ * auVar136._8_4_;
        auVar34._12_4_ = auVar19._12_4_ * auVar136._12_4_;
        auVar34._16_4_ = auVar19._16_4_ * auVar136._16_4_;
        auVar34._20_4_ = auVar19._20_4_ * auVar136._20_4_;
        auVar34._24_4_ = auVar19._24_4_ * auVar136._24_4_;
        auVar34._28_4_ = auVar107._28_4_;
        auVar17 = vfmsub231ps_fma(auVar34,auVar190,auVar164);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar110._0_4_ = auVar164._0_4_ * auVar229._0_4_;
        auVar110._4_4_ = auVar164._4_4_ * auVar229._4_4_;
        auVar110._8_4_ = auVar164._8_4_ * auVar229._8_4_;
        auVar110._12_4_ = auVar164._12_4_ * auVar229._12_4_;
        auVar110._16_4_ = auVar164._16_4_ * auVar229._16_4_;
        auVar110._20_4_ = auVar164._20_4_ * auVar229._20_4_;
        auVar110._24_4_ = auVar164._24_4_ * auVar229._24_4_;
        auVar110._28_4_ = 0;
        auVar17 = vfmsub231ps_fma(auVar110,auVar136,auVar20);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar111._0_4_ = auVar132._0_4_ * auVar7._0_4_;
        auVar111._4_4_ = auVar132._4_4_ * auVar7._4_4_;
        auVar111._8_4_ = auVar132._8_4_ * auVar7._8_4_;
        auVar111._12_4_ = auVar132._12_4_ * auVar7._12_4_;
        auVar111._16_4_ = auVar132._16_4_ * auVar7._16_4_;
        auVar111._20_4_ = auVar132._20_4_ * auVar7._20_4_;
        auVar111._24_4_ = auVar132._24_4_ * auVar7._24_4_;
        auVar111._28_4_ = 0;
        auVar16 = vfmsub231ps_fma(auVar111,auVar106,auVar210);
        auVar35._4_4_ = auVar131._4_4_ * auVar210._4_4_;
        auVar35._0_4_ = auVar131._0_4_ * auVar210._0_4_;
        auVar35._8_4_ = auVar131._8_4_ * auVar210._8_4_;
        auVar35._12_4_ = auVar131._12_4_ * auVar210._12_4_;
        auVar35._16_4_ = auVar131._16_4_ * auVar210._16_4_;
        auVar35._20_4_ = auVar131._20_4_ * auVar210._20_4_;
        auVar35._24_4_ = auVar131._24_4_ * auVar210._24_4_;
        auVar35._28_4_ = auVar210._28_4_;
        auVar103 = vfmsub231ps_fma(auVar35,auVar8,auVar132);
        auVar36._4_4_ = auVar106._4_4_ * auVar8._4_4_;
        auVar36._0_4_ = auVar106._0_4_ * auVar8._0_4_;
        auVar36._8_4_ = auVar106._8_4_ * auVar8._8_4_;
        auVar36._12_4_ = auVar106._12_4_ * auVar8._12_4_;
        auVar36._16_4_ = auVar106._16_4_ * auVar8._16_4_;
        auVar36._20_4_ = auVar106._20_4_ * auVar8._20_4_;
        auVar36._24_4_ = auVar106._24_4_ * auVar8._24_4_;
        auVar36._28_4_ = auVar8._28_4_;
        auVar147 = vfmsub231ps_fma(auVar36,auVar131,auVar7);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar147),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar103 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar103));
        auVar7 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar103));
        auVar7 = vcmpps_avx(auVar7,ZEXT832(0) << 0x20,2);
        auVar16 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
        auVar178 = vpand_avx(auVar178,auVar16);
        auVar7 = vpmovsxwd_avx2(auVar178);
        if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar7 >> 0x7f,0) == '\0') &&
              (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar7 >> 0xbf,0) == '\0') &&
            (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar7[0x1f])
        {
LAB_01673f6f:
          auVar195 = ZEXT3264(CONCAT824(local_500[1]._24_8_,
                                        CONCAT816(local_500[1]._16_8_,
                                                  CONCAT88(local_500[1]._8_8_,local_500[1]._0_8_))))
          ;
          auVar217 = ZEXT3264(auVar113);
          auVar211 = ZEXT3264(auVar138);
        }
        else {
          auVar37._4_4_ = auVar164._4_4_ * auVar132._4_4_;
          auVar37._0_4_ = auVar164._0_4_ * auVar132._0_4_;
          auVar37._8_4_ = auVar164._8_4_ * auVar132._8_4_;
          auVar37._12_4_ = auVar164._12_4_ * auVar132._12_4_;
          auVar37._16_4_ = auVar164._16_4_ * auVar132._16_4_;
          auVar37._20_4_ = auVar164._20_4_ * auVar132._20_4_;
          auVar37._24_4_ = auVar164._24_4_ * auVar132._24_4_;
          auVar37._28_4_ = auVar7._28_4_;
          auVar102 = vfmsub231ps_fma(auVar37,auVar131,auVar20);
          auVar134._0_4_ = auVar106._0_4_ * auVar20._0_4_;
          auVar134._4_4_ = auVar106._4_4_ * auVar20._4_4_;
          auVar134._8_4_ = auVar106._8_4_ * auVar20._8_4_;
          auVar134._12_4_ = auVar106._12_4_ * auVar20._12_4_;
          auVar134._16_4_ = auVar106._16_4_ * auVar20._16_4_;
          auVar134._20_4_ = auVar106._20_4_ * auVar20._20_4_;
          auVar134._24_4_ = auVar106._24_4_ * auVar20._24_4_;
          auVar134._28_4_ = 0;
          auVar126 = vfmsub231ps_fma(auVar134,auVar19,auVar132);
          auVar38._4_4_ = auVar19._4_4_ * auVar131._4_4_;
          auVar38._0_4_ = auVar19._0_4_ * auVar131._0_4_;
          auVar38._8_4_ = auVar19._8_4_ * auVar131._8_4_;
          auVar38._12_4_ = auVar19._12_4_ * auVar131._12_4_;
          auVar38._16_4_ = auVar19._16_4_ * auVar131._16_4_;
          auVar38._20_4_ = auVar19._20_4_ * auVar131._20_4_;
          auVar38._24_4_ = auVar19._24_4_ * auVar131._24_4_;
          auVar38._28_4_ = auVar19._28_4_;
          auVar127 = vfmsub231ps_fma(auVar38,auVar106,auVar164);
          auVar16 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar126),ZEXT1632(auVar127));
          auVar147 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar102),_DAT_02020f00);
          auVar7 = vrcpps_avx(ZEXT1632(auVar147));
          auVar221._8_4_ = 0x3f800000;
          auVar221._0_8_ = &DAT_3f8000003f800000;
          auVar221._12_4_ = 0x3f800000;
          auVar221._16_4_ = 0x3f800000;
          auVar221._20_4_ = 0x3f800000;
          auVar221._24_4_ = 0x3f800000;
          auVar221._28_4_ = 0x3f800000;
          auVar16 = vfnmadd213ps_fma(auVar7,ZEXT1632(auVar147),auVar221);
          auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar7,auVar7);
          auVar39._4_4_ = auVar127._4_4_ * auVar229._4_4_;
          auVar39._0_4_ = auVar127._0_4_ * auVar229._0_4_;
          auVar39._8_4_ = auVar127._8_4_ * auVar229._8_4_;
          auVar39._12_4_ = auVar127._12_4_ * auVar229._12_4_;
          auVar39._16_4_ = auVar229._16_4_ * 0.0;
          auVar39._20_4_ = auVar229._20_4_ * 0.0;
          auVar39._24_4_ = auVar229._24_4_ * 0.0;
          auVar39._28_4_ = auVar229._28_4_;
          auVar126 = vfmadd231ps_fma(auVar39,auVar136,ZEXT1632(auVar126));
          auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),ZEXT1632(auVar102),auVar190);
          fVar99 = auVar16._0_4_;
          fVar116 = auVar16._4_4_;
          fVar118 = auVar16._8_4_;
          fVar120 = auVar16._12_4_;
          auVar40._28_4_ = auVar136._28_4_;
          auVar40._0_28_ =
               ZEXT1628(CONCAT412(fVar120 * auVar126._12_4_,
                                  CONCAT48(fVar118 * auVar126._8_4_,
                                           CONCAT44(fVar116 * auVar126._4_4_,fVar99 * auVar126._0_4_
                                                   ))));
          auVar112._4_4_ = uVar93;
          auVar112._0_4_ = uVar93;
          auVar112._8_4_ = uVar93;
          auVar112._12_4_ = uVar93;
          auVar112._16_4_ = uVar93;
          auVar112._20_4_ = uVar93;
          auVar112._24_4_ = uVar93;
          auVar112._28_4_ = uVar93;
          uVar98 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar135._4_4_ = uVar98;
          auVar135._0_4_ = uVar98;
          auVar135._8_4_ = uVar98;
          auVar135._12_4_ = uVar98;
          auVar135._16_4_ = uVar98;
          auVar135._20_4_ = uVar98;
          auVar135._24_4_ = uVar98;
          auVar135._28_4_ = uVar98;
          auVar190 = vcmpps_avx(auVar112,auVar40,2);
          auVar136 = vcmpps_avx(auVar40,auVar135,2);
          auVar190 = vandps_avx(auVar136,auVar190);
          auVar16 = vpackssdw_avx(auVar190._0_16_,auVar190._16_16_);
          auVar178 = vpand_avx(auVar178,auVar16);
          auVar190 = vpmovsxwd_avx2(auVar178);
          if ((((((((auVar190 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar190 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar190 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar190 >> 0x7f,0) == '\0') &&
                (auVar190 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar190 >> 0xbf,0) == '\0') &&
              (auVar190 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar190[0x1f]) goto LAB_01673f6f;
          auVar190 = vcmpps_avx(ZEXT1632(auVar147),ZEXT832(0) << 0x20,4);
          auVar16 = vpackssdw_avx(auVar190._0_16_,auVar190._16_16_);
          auVar178 = vpand_avx(auVar178,auVar16);
          auVar190 = vpmovsxwd_avx2(auVar178);
          auVar195 = ZEXT3264(CONCAT824(local_500[1]._24_8_,
                                        CONCAT816(local_500[1]._16_8_,
                                                  CONCAT88(local_500[1]._8_8_,local_500[1]._0_8_))))
          ;
          auVar217 = ZEXT3264(auVar113);
          auVar211 = ZEXT3264(auVar138);
          if ((((((((auVar190 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar190 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar190 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar190 >> 0x7f,0) != '\0') ||
                (auVar190 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar190 >> 0xbf,0) != '\0') ||
              (auVar190 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar190[0x1f] < '\0') {
            auVar113 = ZEXT1632(CONCAT412(fVar120 * auVar17._12_4_,
                                          CONCAT48(fVar118 * auVar17._8_4_,
                                                   CONCAT44(fVar116 * auVar17._4_4_,
                                                            fVar99 * auVar17._0_4_))));
            auVar136 = ZEXT1632(CONCAT412(fVar120 * auVar103._12_4_,
                                          CONCAT48(fVar118 * auVar103._8_4_,
                                                   CONCAT44(fVar116 * auVar103._4_4_,
                                                            fVar99 * auVar103._0_4_))));
            auVar182._8_4_ = 0x3f800000;
            auVar182._0_8_ = &DAT_3f8000003f800000;
            auVar182._12_4_ = 0x3f800000;
            auVar182._16_4_ = 0x3f800000;
            auVar182._20_4_ = 0x3f800000;
            auVar182._24_4_ = 0x3f800000;
            auVar182._28_4_ = 0x3f800000;
            auVar138 = vsubps_avx(auVar182,auVar113);
            auVar138 = vblendvps_avx(auVar138,auVar113,auVar18);
            auVar217 = ZEXT3264(auVar138);
            auVar138 = vsubps_avx(auVar182,auVar136);
            local_1e0 = vblendvps_avx(auVar138,auVar136,auVar18);
            auVar195 = ZEXT3264(auVar190);
            auVar211 = ZEXT3264(auVar40);
          }
        }
        auVar204 = ZEXT3264(auVar193);
        auVar227 = ZEXT3264(_local_680);
        auVar143 = ZEXT3264(auVar163);
        auVar138 = auVar195._0_32_;
        if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar138 >> 0x7f,0) != '\0') ||
              (auVar195 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar138 >> 0xbf,0) != '\0') ||
            (auVar195 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar195[0x1f] < '\0') {
          auVar113 = vsubps_avx(ZEXT1632(auVar104),auVar232);
          local_740 = auVar217._0_32_;
          auVar178 = vfmadd213ps_fma(auVar113,local_740,auVar232);
          fVar99 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar113._4_4_ = (auVar178._4_4_ + auVar178._4_4_) * fVar99;
          auVar113._0_4_ = (auVar178._0_4_ + auVar178._0_4_) * fVar99;
          auVar113._8_4_ = (auVar178._8_4_ + auVar178._8_4_) * fVar99;
          auVar113._12_4_ = (auVar178._12_4_ + auVar178._12_4_) * fVar99;
          auVar113._16_4_ = fVar99 * 0.0;
          auVar113._20_4_ = fVar99 * 0.0;
          auVar113._24_4_ = fVar99 * 0.0;
          auVar113._28_4_ = 0;
          local_560 = auVar211._0_32_;
          auVar113 = vcmpps_avx(local_560,auVar113,6);
          auVar190 = auVar138 & auVar113;
          auVar200 = ZEXT3264(local_6a0);
          auVar195 = ZEXT3264(local_720);
          if ((((((((auVar190 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar190 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar190 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar190 >> 0x7f,0) != '\0') ||
                (auVar190 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar190 >> 0xbf,0) != '\0') ||
              (auVar190 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar190[0x1f] < '\0') {
            local_280 = vandps_avx(auVar113,auVar138);
            auVar138._8_4_ = 0xbf800000;
            auVar138._0_8_ = 0xbf800000bf800000;
            auVar138._12_4_ = 0xbf800000;
            auVar138._16_4_ = 0xbf800000;
            auVar138._20_4_ = 0xbf800000;
            auVar138._24_4_ = 0xbf800000;
            auVar138._28_4_ = 0xbf800000;
            auVar158._8_4_ = 0x40000000;
            auVar158._0_8_ = 0x4000000040000000;
            auVar158._12_4_ = 0x40000000;
            auVar158._16_4_ = 0x40000000;
            auVar158._20_4_ = 0x40000000;
            auVar158._24_4_ = 0x40000000;
            auVar158._28_4_ = 0x40000000;
            auVar178 = vfmadd213ps_fma(local_1e0,auVar158,auVar138);
            auVar166 = ZEXT1664(auVar178);
            local_340 = local_740;
            local_1e0 = ZEXT1632(auVar178);
            auVar138 = local_1e0;
            local_320 = ZEXT1632(auVar178);
            local_300 = local_560;
            local_2e0 = 0;
            local_2dc = iVar10;
            local_2d0 = uVar82;
            uStack_2c8 = uVar83;
            local_2c0 = local_620._0_8_;
            uStack_2b8 = local_620._8_8_;
            local_2b0 = local_630._0_8_;
            uStack_2a8 = local_630._8_8_;
            local_2a0 = local_640;
            uStack_298 = uStack_638;
            local_1e0 = auVar138;
            if ((pGVar95->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar145 = 1.0 / auVar108._0_4_;
              local_260[0] = fVar145 * (auVar217._0_4_ + 0.0);
              local_260[1] = fVar145 * (auVar217._4_4_ + 1.0);
              local_260[2] = fVar145 * (auVar217._8_4_ + 2.0);
              local_260[3] = fVar145 * (auVar217._12_4_ + 3.0);
              fStack_250 = fVar145 * (auVar217._16_4_ + 4.0);
              fStack_24c = fVar145 * (auVar217._20_4_ + 5.0);
              fStack_248 = fVar145 * (auVar217._24_4_ + 6.0);
              fStack_244 = auVar217._28_4_ + 7.0;
              local_1e0._0_8_ = auVar178._0_8_;
              local_1e0._8_8_ = auVar178._8_8_;
              local_240 = local_1e0._0_8_;
              uStack_238 = local_1e0._8_8_;
              uStack_230 = 0;
              uStack_228 = 0;
              local_220 = local_560;
              auVar137._8_4_ = 0x7f800000;
              auVar137._0_8_ = 0x7f8000007f800000;
              auVar137._12_4_ = 0x7f800000;
              auVar137._16_4_ = 0x7f800000;
              auVar137._20_4_ = 0x7f800000;
              auVar137._24_4_ = 0x7f800000;
              auVar137._28_4_ = 0x7f800000;
              auVar138 = vblendvps_avx(auVar137,local_560,local_280);
              auVar113 = vshufps_avx(auVar138,auVar138,0xb1);
              auVar113 = vminps_avx(auVar138,auVar113);
              auVar190 = vshufpd_avx(auVar113,auVar113,5);
              auVar113 = vminps_avx(auVar113,auVar190);
              auVar190 = vpermpd_avx2(auVar113,0x4e);
              auVar113 = vminps_avx(auVar113,auVar190);
              auVar113 = vcmpps_avx(auVar138,auVar113,0);
              auVar190 = local_280 & auVar113;
              auVar138 = local_280;
              if ((((((((auVar190 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar190 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar190 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar190 >> 0x7f,0) != '\0') ||
                    (auVar190 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar190 >> 0xbf,0) != '\0') ||
                  (auVar190 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar190[0x1f] < '\0') {
                auVar138 = vandps_avx(auVar113,local_280);
              }
              uVar91 = vmovmskps_avx(auVar138);
              uVar93 = 0;
              for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
                uVar93 = uVar93 + 1;
              }
              uVar92 = (ulong)uVar93;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar95->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar145 = local_260[uVar92];
                uVar98 = *(undefined4 *)((long)&local_240 + uVar92 * 4);
                fVar117 = 1.0 - fVar145;
                auVar173 = ZEXT416((uint)(fVar145 * fVar117 * 4.0));
                auVar178 = vfnmsub213ss_fma(ZEXT416((uint)fVar145),ZEXT416((uint)fVar145),auVar173);
                auVar173 = vfmadd213ss_fma(ZEXT416((uint)fVar117),ZEXT416((uint)fVar117),auVar173);
                fVar117 = fVar117 * -fVar117 * 0.5;
                fVar119 = auVar178._0_4_ * 0.5;
                fVar234 = auVar173._0_4_ * 0.5;
                fVar235 = fVar145 * fVar145 * 0.5;
                auVar195 = ZEXT3264(local_720);
                auVar171._0_4_ = fVar235 * (float)local_640._0_4_;
                auVar171._4_4_ = fVar235 * (float)local_640._4_4_;
                auVar171._8_4_ = fVar235 * (float)uStack_638;
                auVar171._12_4_ = fVar235 * uStack_638._4_4_;
                auVar148._4_4_ = fVar234;
                auVar148._0_4_ = fVar234;
                auVar148._8_4_ = fVar234;
                auVar148._12_4_ = fVar234;
                auVar173 = vfmadd132ps_fma(auVar148,auVar171,local_630);
                auVar172._4_4_ = fVar119;
                auVar172._0_4_ = fVar119;
                auVar172._8_4_ = fVar119;
                auVar172._12_4_ = fVar119;
                auVar173 = vfmadd132ps_fma(auVar172,auVar173,local_620);
                auVar149._4_4_ = fVar117;
                auVar149._0_4_ = fVar117;
                auVar149._8_4_ = fVar117;
                auVar149._12_4_ = fVar117;
                auVar173 = vfmadd132ps_fma(auVar149,auVar173,*(undefined1 (*) [16])pPVar1);
                auVar166 = ZEXT464(*(uint *)(local_220 + uVar92 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_220 + uVar92 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar173._0_4_;
                uVar218 = vextractps_avx(auVar173,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar218;
                uVar218 = vextractps_avx(auVar173,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar218;
                *(float *)(ray + k * 4 + 0xf0) = fVar145;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar98;
                *(undefined4 *)(ray + k * 4 + 0x110) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x120) = local_7a0._4_4_;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_7a0._0_4_ = local_7a0._4_4_;
                local_7a0._8_4_ = local_7a0._4_4_;
                local_7a0._12_4_ = local_7a0._4_4_;
                local_580._4_4_ = uVar4;
                local_580._0_4_ = uVar4;
                local_580._8_4_ = uVar4;
                local_580._12_4_ = uVar4;
                local_580._16_16_ = auVar14._16_16_;
                local_5e0 = ZEXT1632(local_620);
                local_540 = ZEXT1632(local_630);
                _local_480 = ZEXT1632(_local_640);
                local_4a0 = ZEXT1632(*local_608);
                local_600 = auVar163;
                local_500[0] = local_280;
                do {
                  uVar98 = *(undefined4 *)(ray + k * 4 + 0x80);
                  fVar145 = local_260[uVar92];
                  local_3a0._4_4_ = fVar145;
                  local_3a0._0_4_ = fVar145;
                  local_3a0._8_4_ = fVar145;
                  local_3a0._12_4_ = fVar145;
                  uVar218 = *(undefined4 *)((long)&local_240 + uVar92 * 4);
                  auVar129._4_4_ = uVar218;
                  auVar129._0_4_ = uVar218;
                  auVar129._8_4_ = uVar218;
                  auVar129._12_4_ = uVar218;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_220 + uVar92 * 4);
                  fVar119 = 1.0 - fVar145;
                  auVar178 = ZEXT416((uint)(fVar145 * fVar119 * 4.0));
                  auVar16 = vfnmsub213ss_fma(local_3a0,local_3a0,auVar178);
                  auVar178 = vfmadd213ss_fma(ZEXT416((uint)fVar119),ZEXT416((uint)fVar119),auVar178)
                  ;
                  fVar117 = auVar178._0_4_ * 0.5;
                  fVar145 = fVar145 * fVar145 * 0.5;
                  auVar179._0_4_ = fVar145 * (float)local_480._0_4_;
                  auVar179._4_4_ = fVar145 * (float)local_480._4_4_;
                  auVar179._8_4_ = fVar145 * fStack_478;
                  auVar179._12_4_ = fVar145 * fStack_474;
                  auVar154._4_4_ = fVar117;
                  auVar154._0_4_ = fVar117;
                  auVar154._8_4_ = fVar117;
                  auVar154._12_4_ = fVar117;
                  auVar178 = vfmadd132ps_fma(auVar154,auVar179,local_540._0_16_);
                  fVar145 = auVar16._0_4_ * 0.5;
                  auVar180._4_4_ = fVar145;
                  auVar180._0_4_ = fVar145;
                  auVar180._8_4_ = fVar145;
                  auVar180._12_4_ = fVar145;
                  auVar178 = vfmadd132ps_fma(auVar180,auVar178,local_5e0._0_16_);
                  local_6f0.context = context->user;
                  fVar145 = fVar119 * -fVar119 * 0.5;
                  auVar155._4_4_ = fVar145;
                  auVar155._0_4_ = fVar145;
                  auVar155._8_4_ = fVar145;
                  auVar155._12_4_ = fVar145;
                  auVar178 = vfmadd132ps_fma(auVar155,auVar178,auVar173);
                  local_3d0 = auVar178._0_4_;
                  uStack_3cc = local_3d0;
                  uStack_3c8 = local_3d0;
                  uStack_3c4 = local_3d0;
                  local_3c0 = vshufps_avx(auVar178,auVar178,0x55);
                  auVar166 = ZEXT1664(local_3c0);
                  local_3b0 = vshufps_avx(auVar178,auVar178,0xaa);
                  local_390 = auVar129;
                  local_380 = local_580._0_8_;
                  uStack_378 = local_580._8_8_;
                  local_370 = local_7a0;
                  vpcmpeqd_avx2(ZEXT1632(local_7a0),ZEXT1632(local_7a0));
                  uStack_35c = (local_6f0.context)->instID[0];
                  local_360 = uStack_35c;
                  uStack_358 = uStack_35c;
                  uStack_354 = uStack_35c;
                  uStack_350 = (local_6f0.context)->instPrimID[0];
                  uStack_34c = uStack_350;
                  uStack_348 = uStack_350;
                  uStack_344 = uStack_350;
                  local_770 = local_4a0._0_8_;
                  uStack_768 = local_4a0._8_8_;
                  local_6f0.valid = (int *)&local_770;
                  local_6f0.geometryUserPtr = *(void **)(CONCAT44(fStack_4bc,local_4c0) + 0x18);
                  local_6f0.hit = (RTCHitN *)&local_3d0;
                  local_6f0.N = 4;
                  pcVar12 = *(code **)(CONCAT44(fStack_4bc,local_4c0) + 0x40);
                  local_6f0.ray = (RTCRayN *)ray;
                  if (pcVar12 != (code *)0x0) {
                    auVar166 = ZEXT1664(local_3c0);
                    (*pcVar12)(&local_6f0);
                    auVar211._8_56_ = extraout_var;
                    auVar211._0_8_ = extraout_XMM1_Qa;
                    auVar129 = auVar211._0_16_;
                    auVar227 = ZEXT3264(_local_680);
                    auVar143 = ZEXT3264(local_600);
                    auVar200 = ZEXT3264(local_6a0);
                    auVar204 = ZEXT3264(local_760);
                    auVar211 = ZEXT3264(local_560);
                    auVar217 = ZEXT3264(local_740);
                  }
                  auVar86._8_8_ = uStack_768;
                  auVar86._0_8_ = local_770;
                  if (auVar86 == (undefined1  [16])0x0) {
                    auVar178 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar16 = vpcmpeqd_avx(auVar129,auVar129);
                    auVar178 = auVar178 ^ auVar16;
                    auVar195 = ZEXT3264(local_720);
                  }
                  else {
                    p_Var11 = context->args->filter;
                    auVar178 = vpcmpeqd_avx(auVar166._0_16_,auVar166._0_16_);
                    auVar166 = ZEXT1664(auVar178);
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(fStack_4bc,local_4c0) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var11)(&local_6f0);
                      auVar227 = ZEXT3264(_local_680);
                      auVar143 = ZEXT3264(local_600);
                      auVar200 = ZEXT3264(local_6a0);
                      auVar204 = ZEXT3264(local_760);
                      auVar211 = ZEXT3264(local_560);
                      auVar217 = ZEXT3264(local_740);
                      auVar178 = vpcmpeqd_avx(auVar178,auVar178);
                      auVar166 = ZEXT1664(auVar178);
                    }
                    auVar87._8_8_ = uStack_768;
                    auVar87._0_8_ = local_770;
                    auVar16 = vpcmpeqd_avx(auVar87,_DAT_01feba10);
                    auVar178 = auVar16 ^ auVar166._0_16_;
                    auVar195 = ZEXT3264(local_720);
                    if (auVar87 != (undefined1  [16])0x0) {
                      auVar16 = auVar16 ^ auVar166._0_16_;
                      auVar17 = vmaskmovps_avx(auVar16,*(undefined1 (*) [16])local_6f0.hit);
                      *(undefined1 (*) [16])(local_6f0.ray + 0xc0) = auVar17;
                      auVar17 = vmaskmovps_avx(auVar16,*(undefined1 (*) [16])(local_6f0.hit + 0x10))
                      ;
                      *(undefined1 (*) [16])(local_6f0.ray + 0xd0) = auVar17;
                      auVar17 = vmaskmovps_avx(auVar16,*(undefined1 (*) [16])(local_6f0.hit + 0x20))
                      ;
                      *(undefined1 (*) [16])(local_6f0.ray + 0xe0) = auVar17;
                      auVar17 = vmaskmovps_avx(auVar16,*(undefined1 (*) [16])(local_6f0.hit + 0x30))
                      ;
                      *(undefined1 (*) [16])(local_6f0.ray + 0xf0) = auVar17;
                      auVar17 = vmaskmovps_avx(auVar16,*(undefined1 (*) [16])(local_6f0.hit + 0x40))
                      ;
                      *(undefined1 (*) [16])(local_6f0.ray + 0x100) = auVar17;
                      auVar17 = vmaskmovps_avx(auVar16,*(undefined1 (*) [16])(local_6f0.hit + 0x50))
                      ;
                      *(undefined1 (*) [16])(local_6f0.ray + 0x110) = auVar17;
                      auVar17 = vmaskmovps_avx(auVar16,*(undefined1 (*) [16])(local_6f0.hit + 0x60))
                      ;
                      *(undefined1 (*) [16])(local_6f0.ray + 0x120) = auVar17;
                      auVar17 = vmaskmovps_avx(auVar16,*(undefined1 (*) [16])(local_6f0.hit + 0x70))
                      ;
                      *(undefined1 (*) [16])(local_6f0.ray + 0x130) = auVar17;
                      auVar16 = vmaskmovps_avx(auVar16,*(undefined1 (*) [16])(local_6f0.hit + 0x80))
                      ;
                      *(undefined1 (*) [16])(local_6f0.ray + 0x140) = auVar16;
                    }
                  }
                  auVar163 = auVar143._0_32_;
                  auVar193 = auVar204._0_32_;
                  auVar130._8_8_ = 0x100000001;
                  auVar130._0_8_ = 0x100000001;
                  if ((auVar130 & auVar178) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar98;
                  }
                  *(undefined4 *)(local_500[0] + uVar92 * 4) = 0;
                  uVar98 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar115._4_4_ = uVar98;
                  auVar115._0_4_ = uVar98;
                  auVar115._8_4_ = uVar98;
                  auVar115._12_4_ = uVar98;
                  auVar115._16_4_ = uVar98;
                  auVar115._20_4_ = uVar98;
                  auVar115._24_4_ = uVar98;
                  auVar115._28_4_ = uVar98;
                  auVar113 = vcmpps_avx(auVar211._0_32_,auVar115,2);
                  auVar138 = vandps_avx(auVar113,local_500[0]);
                  local_500[0] = local_500[0] & auVar113;
                  bVar79 = (local_500[0] >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar80 = (local_500[0] >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar78 = (local_500[0] >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar77 = SUB321(local_500[0] >> 0x7f,0) != '\0';
                  bVar76 = (local_500[0] & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar75 = SUB321(local_500[0] >> 0xbf,0) != '\0';
                  bVar73 = (local_500[0] & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar72 = local_500[0][0x1f] < '\0';
                  if (((((((bVar79 || bVar80) || bVar78) || bVar77) || bVar76) || bVar75) || bVar73)
                      || bVar72) {
                    auVar142._8_4_ = 0x7f800000;
                    auVar142._0_8_ = 0x7f8000007f800000;
                    auVar142._12_4_ = 0x7f800000;
                    auVar142._16_4_ = 0x7f800000;
                    auVar142._20_4_ = 0x7f800000;
                    auVar142._24_4_ = 0x7f800000;
                    auVar142._28_4_ = 0x7f800000;
                    auVar113 = vblendvps_avx(auVar142,auVar211._0_32_,auVar138);
                    auVar190 = vshufps_avx(auVar113,auVar113,0xb1);
                    auVar190 = vminps_avx(auVar113,auVar190);
                    auVar136 = vshufpd_avx(auVar190,auVar190,5);
                    auVar190 = vminps_avx(auVar190,auVar136);
                    auVar136 = vpermpd_avx2(auVar190,0x4e);
                    auVar166 = ZEXT3264(auVar136);
                    auVar190 = vminps_avx(auVar190,auVar136);
                    auVar190 = vcmpps_avx(auVar113,auVar190,0);
                    auVar136 = auVar138 & auVar190;
                    auVar113 = auVar138;
                    if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar136 >> 0x7f,0) != '\0') ||
                          (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar136 >> 0xbf,0) != '\0') ||
                        (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar136[0x1f] < '\0') {
                      auVar113 = vandps_avx(auVar190,auVar138);
                    }
                    uVar91 = vmovmskps_avx(auVar113);
                    uVar93 = 0;
                    for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
                      uVar93 = uVar93 + 1;
                    }
                    uVar92 = (ulong)uVar93;
                  }
                  local_500[0] = auVar138;
                } while (((((((bVar79 || bVar80) || bVar78) || bVar77) || bVar76) || bVar75) ||
                         bVar73) || bVar72);
              }
            }
            auVar143 = ZEXT3264(local_5c0);
            auVar204 = ZEXT3264(auVar193);
            fVar161 = (float)local_6c0;
            fVar167 = local_6c0._4_4_;
            fVar145 = (float)uStack_6b8;
            fVar117 = uStack_6b8._4_4_;
            fVar119 = (float)uStack_6b0;
            fVar234 = uStack_6b0._4_4_;
            fVar235 = (float)uStack_6a8;
            goto LAB_01672b55;
          }
        }
        auVar200 = ZEXT3264(local_6a0);
        auVar195 = ZEXT3264(local_720);
        auVar143 = ZEXT3264(local_5c0);
        auVar204 = ZEXT3264(auVar193);
      }
LAB_01672b55:
      if (8 < iVar10) {
        _local_680 = auVar227._0_32_;
        local_1a0._4_4_ = iVar10;
        local_1a0._0_4_ = iVar10;
        local_1a0._8_4_ = iVar10;
        local_1a0._12_4_ = iVar10;
        local_1a0._16_4_ = iVar10;
        local_1a0._20_4_ = iVar10;
        local_1a0._24_4_ = iVar10;
        local_1a0._28_4_ = iVar10;
        local_140 = local_520._0_4_;
        uStack_13c = local_520._0_4_;
        uStack_138 = local_520._0_4_;
        uStack_134 = local_520._0_4_;
        uStack_130 = local_520._0_4_;
        uStack_12c = local_520._0_4_;
        uStack_128 = local_520._0_4_;
        uStack_124 = local_520._0_4_;
        fStack_410 = 1.0 / local_420;
        auStack_41c._0_4_ = fStack_410;
        local_420 = fStack_410;
        auStack_41c._4_4_ = fStack_410;
        fStack_414 = fStack_410;
        local_170 = local_7a0._4_4_;
        uStack_16c = local_7a0._4_4_;
        uStack_168 = local_7a0._4_4_;
        uStack_164 = local_7a0._4_4_;
        local_180 = uVar4;
        uStack_17c = uVar4;
        uStack_178 = uVar4;
        uStack_174 = uVar4;
        lVar96 = 8;
        local_740 = auVar217._0_32_;
        local_560 = auVar211._0_32_;
        fVar99 = local_660;
        fVar116 = fStack_65c;
        fVar118 = fStack_658;
        fVar120 = fStack_654;
        fVar121 = fStack_650;
        fVar122 = fStack_64c;
        fVar123 = fStack_648;
        fVar160 = fStack_644;
        local_600 = auVar163;
        local_4c0 = fVar146;
        fStack_4bc = fVar146;
        fStack_4b8 = fVar146;
        fStack_4b4 = fVar146;
        fStack_4b0 = fVar146;
        fStack_4ac = fVar146;
        fStack_4a8 = fVar146;
        fStack_4a4 = fVar146;
        fStack_40c = fStack_410;
        fStack_408 = fStack_410;
        fStack_404 = fStack_410;
        do {
          auVar103 = local_620;
          auVar104 = local_630;
          auVar138 = *(undefined1 (*) [32])(bspline_basis0 + lVar96 * 4 + lVar21);
          auVar113 = *(undefined1 (*) [32])(lVar21 + 0x222bfac + lVar96 * 4);
          _local_520 = *(undefined1 (*) [32])(lVar21 + 0x222c430 + lVar96 * 4);
          pauVar2 = (undefined1 (*) [28])(lVar21 + 0x222c8b4 + lVar96 * 4);
          auVar90 = *pauVar2;
          auVar228._0_4_ = fVar99 * *(float *)*pauVar2;
          auVar228._4_4_ = fVar116 * *(float *)(*pauVar2 + 4);
          auVar228._8_4_ = fVar118 * *(float *)(*pauVar2 + 8);
          auVar228._12_4_ = fVar120 * *(float *)(*pauVar2 + 0xc);
          auVar228._16_4_ = fVar121 * *(float *)(*pauVar2 + 0x10);
          auVar228._20_4_ = fVar122 * *(float *)(*pauVar2 + 0x14);
          auVar228._28_36_ = auVar227._28_36_;
          auVar228._24_4_ = fVar123 * *(float *)(*pauVar2 + 0x18);
          auVar227._0_4_ = fVar161 * *(float *)*pauVar2;
          auVar227._4_4_ = fVar167 * *(float *)(*pauVar2 + 4);
          auVar227._8_4_ = fVar145 * *(float *)(*pauVar2 + 8);
          auVar227._12_4_ = fVar117 * *(float *)(*pauVar2 + 0xc);
          auVar227._16_4_ = fVar119 * *(float *)(*pauVar2 + 0x10);
          auVar227._20_4_ = fVar234 * *(float *)(*pauVar2 + 0x14);
          auVar227._28_36_ = auVar166._28_36_;
          auVar227._24_4_ = fVar235 * *(float *)(*pauVar2 + 0x18);
          auVar173 = vfmadd231ps_fma(auVar228._0_32_,_local_520,local_5a0);
          auVar178 = vfmadd231ps_fma(auVar227._0_32_,_local_520,auVar204._0_32_);
          auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar113,auVar200._0_32_);
          auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar113,auVar143._0_32_);
          auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar138,auVar195._0_32_);
          auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar138,local_400);
          auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar96 * 4 + lVar21);
          auVar190 = *(undefined1 (*) [32])(lVar21 + 0x222e3cc + lVar96 * 4);
          auVar136 = *(undefined1 (*) [32])(lVar21 + 0x222e850 + lVar96 * 4);
          pfVar3 = (float *)(lVar21 + 0x222ecd4 + lVar96 * 4);
          fVar124 = *pfVar3;
          fVar144 = pfVar3[1];
          fVar212 = pfVar3[2];
          fVar213 = pfVar3[3];
          fVar214 = pfVar3[4];
          fVar215 = pfVar3[5];
          fVar81 = pfVar3[6];
          auVar41._4_4_ = fVar116 * fVar144;
          auVar41._0_4_ = fVar99 * fVar124;
          auVar41._8_4_ = fVar118 * fVar212;
          auVar41._12_4_ = fVar120 * fVar213;
          auVar41._16_4_ = fVar121 * fVar214;
          auVar41._20_4_ = fVar122 * fVar215;
          auVar41._24_4_ = fVar123 * fVar81;
          auVar41._28_4_ = fVar160;
          auVar196._0_4_ = fVar161 * fVar124;
          auVar196._4_4_ = fVar167 * fVar144;
          auVar196._8_4_ = fVar145 * fVar212;
          auVar196._12_4_ = fVar117 * fVar213;
          auVar196._16_4_ = fVar119 * fVar214;
          auVar196._20_4_ = fVar234 * fVar215;
          auVar196._28_36_ = auVar195._28_36_;
          auVar196._24_4_ = fVar235 * fVar81;
          auVar16 = vfmadd231ps_fma(auVar41,auVar136,local_5a0);
          auVar17 = vfmadd231ps_fma(auVar196._0_32_,auVar136,auVar204._0_32_);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar190,auVar200._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar190,auVar143._0_32_);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar107,auVar195._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar107,local_400);
          auVar222 = ZEXT1632(auVar16);
          local_4a0 = ZEXT1632(auVar173);
          auVar7 = vsubps_avx(auVar222,local_4a0);
          _local_480 = ZEXT1632(auVar17);
          auVar164 = ZEXT1632(auVar178);
          auVar8 = vsubps_avx(_local_480,auVar164);
          auVar42._4_4_ = auVar178._4_4_ * auVar7._4_4_;
          auVar42._0_4_ = auVar178._0_4_ * auVar7._0_4_;
          auVar42._8_4_ = auVar178._8_4_ * auVar7._8_4_;
          auVar42._12_4_ = auVar178._12_4_ * auVar7._12_4_;
          auVar42._16_4_ = auVar7._16_4_ * 0.0;
          auVar42._20_4_ = auVar7._20_4_ * 0.0;
          auVar42._24_4_ = auVar7._24_4_ * 0.0;
          auVar42._28_4_ = local_400._28_4_;
          fVar146 = auVar8._0_4_;
          auVar166._0_4_ = auVar173._0_4_ * fVar146;
          fVar145 = auVar8._4_4_;
          auVar166._4_4_ = auVar173._4_4_ * fVar145;
          fVar117 = auVar8._8_4_;
          auVar166._8_4_ = auVar173._8_4_ * fVar117;
          fVar119 = auVar8._12_4_;
          auVar166._12_4_ = auVar173._12_4_ * fVar119;
          fVar234 = auVar8._16_4_;
          auVar166._16_4_ = fVar234 * 0.0;
          fVar235 = auVar8._20_4_;
          auVar166._20_4_ = fVar235 * 0.0;
          fVar99 = auVar8._24_4_;
          auVar166._28_36_ = auVar143._28_36_;
          auVar166._24_4_ = fVar99 * 0.0;
          auVar227 = ZEXT3264(_local_520);
          auVar210 = vsubps_avx(auVar42,auVar166._0_32_);
          local_7e0 = auVar90._0_4_;
          fStack_7dc = auVar90._4_4_;
          fStack_7d8 = auVar90._8_4_;
          fStack_7d4 = auVar90._12_4_;
          fStack_7d0 = auVar90._16_4_;
          fStack_7cc = auVar90._20_4_;
          fStack_7c8 = auVar90._24_4_;
          auVar43._4_4_ = local_e0._4_4_ * fStack_7dc;
          auVar43._0_4_ = (float)local_e0 * local_7e0;
          auVar43._8_4_ = (float)uStack_d8 * fStack_7d8;
          auVar43._12_4_ = uStack_d8._4_4_ * fStack_7d4;
          auVar43._16_4_ = (float)uStack_d0 * fStack_7d0;
          auVar43._20_4_ = uStack_d0._4_4_ * fStack_7cc;
          auVar43._24_4_ = (float)uStack_c8 * fStack_7c8;
          auVar43._28_4_ = local_5a0._28_4_;
          auVar173 = vfmadd231ps_fma(auVar43,_local_520,local_c0);
          auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar113,local_a0);
          auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),local_80,auVar138);
          auVar44._4_4_ = local_e0._4_4_ * fVar144;
          auVar44._0_4_ = (float)local_e0 * fVar124;
          auVar44._8_4_ = (float)uStack_d8 * fVar212;
          auVar44._12_4_ = uStack_d8._4_4_ * fVar213;
          auVar44._16_4_ = (float)uStack_d0 * fVar214;
          auVar44._20_4_ = uStack_d0._4_4_ * fVar215;
          auVar44._24_4_ = (float)uStack_c8 * fVar81;
          auVar44._28_4_ = uStack_c8._4_4_;
          auVar178 = vfmadd231ps_fma(auVar44,auVar136,local_c0);
          auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar190,local_a0);
          auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar107,local_80);
          auVar45._4_4_ = fVar145 * fVar145;
          auVar45._0_4_ = fVar146 * fVar146;
          auVar45._8_4_ = fVar117 * fVar117;
          auVar45._12_4_ = fVar119 * fVar119;
          auVar45._16_4_ = fVar234 * fVar234;
          auVar45._20_4_ = fVar235 * fVar235;
          auVar45._24_4_ = fVar99 * fVar99;
          auVar45._28_4_ = local_80._28_4_;
          auVar17 = vfmadd231ps_fma(auVar45,auVar7,auVar7);
          auVar229 = vmaxps_avx(ZEXT1632(auVar173),ZEXT1632(auVar178));
          auVar207._0_4_ = auVar229._0_4_ * auVar229._0_4_ * auVar17._0_4_;
          auVar207._4_4_ = auVar229._4_4_ * auVar229._4_4_ * auVar17._4_4_;
          auVar207._8_4_ = auVar229._8_4_ * auVar229._8_4_ * auVar17._8_4_;
          auVar207._12_4_ = auVar229._12_4_ * auVar229._12_4_ * auVar17._12_4_;
          auVar207._16_4_ = auVar229._16_4_ * auVar229._16_4_ * 0.0;
          auVar207._20_4_ = auVar229._20_4_ * auVar229._20_4_ * 0.0;
          auVar207._24_4_ = auVar229._24_4_ * auVar229._24_4_ * 0.0;
          auVar207._28_4_ = 0;
          auVar46._4_4_ = auVar210._4_4_ * auVar210._4_4_;
          auVar46._0_4_ = auVar210._0_4_ * auVar210._0_4_;
          auVar46._8_4_ = auVar210._8_4_ * auVar210._8_4_;
          auVar46._12_4_ = auVar210._12_4_ * auVar210._12_4_;
          auVar46._16_4_ = auVar210._16_4_ * auVar210._16_4_;
          auVar46._20_4_ = auVar210._20_4_ * auVar210._20_4_;
          auVar46._24_4_ = auVar210._24_4_ * auVar210._24_4_;
          auVar46._28_4_ = auVar210._28_4_;
          auVar229 = vcmpps_avx(auVar46,auVar207,2);
          auVar166 = ZEXT3264(auVar229);
          local_2e0 = (int)lVar96;
          auVar208._4_4_ = local_2e0;
          auVar208._0_4_ = local_2e0;
          auVar208._8_4_ = local_2e0;
          auVar208._12_4_ = local_2e0;
          auVar208._16_4_ = local_2e0;
          auVar208._20_4_ = local_2e0;
          auVar208._24_4_ = local_2e0;
          auVar208._28_4_ = local_2e0;
          auVar210 = vpor_avx2(auVar208,_DAT_0205a920);
          auVar14 = vpcmpgtd_avx2(local_1a0,auVar210);
          auVar210 = auVar14 & auVar229;
          fVar99 = local_660;
          fVar116 = fStack_65c;
          fVar118 = fStack_658;
          fVar120 = fStack_654;
          fVar121 = fStack_650;
          fVar122 = fStack_64c;
          fVar123 = fStack_648;
          fVar160 = fStack_644;
          fVar161 = (float)local_6c0;
          fVar167 = local_6c0._4_4_;
          fVar145 = (float)uStack_6b8;
          fVar117 = uStack_6b8._4_4_;
          fVar119 = (float)uStack_6b0;
          fVar234 = uStack_6b0._4_4_;
          fVar235 = (float)uStack_6a8;
          if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar210 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar210 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar210 >> 0x7f,0) == '\0') &&
                (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar210 >> 0xbf,0) == '\0') &&
              (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar210[0x1f]) {
LAB_01673702:
            auVar204 = ZEXT3264(local_760);
            auVar143 = ZEXT3264(local_5c0);
            auVar200 = ZEXT3264(local_6a0);
            auVar195 = ZEXT3264(local_720);
          }
          else {
            local_1c0 = vandps_avx(auVar14,auVar229);
            auVar47._4_4_ = (float)local_680._4_4_ * fVar144;
            auVar47._0_4_ = (float)local_680._0_4_ * fVar124;
            auVar47._8_4_ = fStack_678 * fVar212;
            auVar47._12_4_ = fStack_674 * fVar213;
            auVar47._16_4_ = fStack_670 * fVar214;
            auVar47._20_4_ = fStack_66c * fVar215;
            auVar47._24_4_ = fStack_668 * fVar81;
            auVar47._28_4_ = auVar229._28_4_;
            auVar17 = vfmadd213ps_fma(auVar136,local_460,auVar47);
            auVar17 = vfmadd213ps_fma(auVar190,local_100,ZEXT1632(auVar17));
            auVar17 = vfmadd132ps_fma(auVar107,ZEXT1632(auVar17),local_600);
            auVar48._4_4_ = (float)local_680._4_4_ * fStack_7dc;
            auVar48._0_4_ = (float)local_680._0_4_ * local_7e0;
            auVar48._8_4_ = fStack_678 * fStack_7d8;
            auVar48._12_4_ = fStack_674 * fStack_7d4;
            auVar48._16_4_ = fStack_670 * fStack_7d0;
            auVar48._20_4_ = fStack_66c * fStack_7cc;
            auVar48._24_4_ = fStack_668 * fStack_7c8;
            auVar48._28_4_ = auVar229._28_4_;
            auVar147 = vfmadd213ps_fma(_local_520,local_460,auVar48);
            auVar147 = vfmadd213ps_fma(auVar113,local_100,ZEXT1632(auVar147));
            auVar113 = *(undefined1 (*) [32])(lVar21 + 0x222cd38 + lVar96 * 4);
            auVar190 = *(undefined1 (*) [32])(lVar21 + 0x222d1bc + lVar96 * 4);
            auVar136 = *(undefined1 (*) [32])(lVar21 + 0x222d640 + lVar96 * 4);
            pfVar3 = (float *)(lVar21 + 0x222dac4 + lVar96 * 4);
            fVar146 = *pfVar3;
            fVar124 = pfVar3[1];
            fVar144 = pfVar3[2];
            fVar212 = pfVar3[3];
            fVar213 = pfVar3[4];
            fVar214 = pfVar3[5];
            fVar215 = pfVar3[6];
            auVar203._0_4_ = local_660 * fVar146;
            auVar203._4_4_ = fStack_65c * fVar124;
            auVar203._8_4_ = fStack_658 * fVar144;
            auVar203._12_4_ = fStack_654 * fVar212;
            auVar203._16_4_ = fStack_650 * fVar213;
            auVar203._20_4_ = fStack_64c * fVar214;
            auVar203._24_4_ = fStack_648 * fVar215;
            auVar203._28_4_ = 0;
            auVar225._0_4_ = (float)local_6c0 * fVar146;
            auVar225._4_4_ = local_6c0._4_4_ * fVar124;
            auVar225._8_4_ = (float)uStack_6b8 * fVar144;
            auVar225._12_4_ = uStack_6b8._4_4_ * fVar212;
            auVar225._16_4_ = (float)uStack_6b0 * fVar213;
            auVar225._20_4_ = uStack_6b0._4_4_ * fVar214;
            auVar225._24_4_ = (float)uStack_6a8 * fVar215;
            auVar225._28_4_ = 0;
            auVar49._4_4_ = fVar124 * (float)local_680._4_4_;
            auVar49._0_4_ = fVar146 * (float)local_680._0_4_;
            auVar49._8_4_ = fVar144 * fStack_678;
            auVar49._12_4_ = fVar212 * fStack_674;
            auVar49._16_4_ = fVar213 * fStack_670;
            auVar49._20_4_ = fVar214 * fStack_66c;
            auVar49._24_4_ = fVar215 * fStack_668;
            auVar49._28_4_ = pfVar3[7];
            auVar126 = vfmadd231ps_fma(auVar203,auVar136,local_5a0);
            auVar102 = vfmadd231ps_fma(auVar225,auVar136,local_760);
            auVar127 = vfmadd231ps_fma(auVar49,local_460,auVar136);
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar190,local_6a0);
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar190,local_5c0);
            auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),local_100,auVar190);
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar113,local_720);
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar113,local_400);
            auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar113,local_600);
            pfVar3 = (float *)(lVar21 + 0x222fee4 + lVar96 * 4);
            fVar146 = *pfVar3;
            fVar124 = pfVar3[1];
            fVar144 = pfVar3[2];
            fVar212 = pfVar3[3];
            fVar213 = pfVar3[4];
            fVar214 = pfVar3[5];
            fVar215 = pfVar3[6];
            auVar50._4_4_ = fStack_65c * fVar124;
            auVar50._0_4_ = local_660 * fVar146;
            auVar50._8_4_ = fStack_658 * fVar144;
            auVar50._12_4_ = fStack_654 * fVar212;
            auVar50._16_4_ = fStack_650 * fVar213;
            auVar50._20_4_ = fStack_64c * fVar214;
            auVar50._24_4_ = fStack_648 * fVar215;
            auVar50._28_4_ = fStack_644;
            auVar51._4_4_ = local_6c0._4_4_ * fVar124;
            auVar51._0_4_ = (float)local_6c0 * fVar146;
            auVar51._8_4_ = (float)uStack_6b8 * fVar144;
            auVar51._12_4_ = uStack_6b8._4_4_ * fVar212;
            auVar51._16_4_ = (float)uStack_6b0 * fVar213;
            auVar51._20_4_ = uStack_6b0._4_4_ * fVar214;
            auVar51._24_4_ = (float)uStack_6a8 * fVar215;
            auVar51._28_4_ = uStack_6a8._4_4_;
            auVar52._4_4_ = fVar124 * (float)local_680._4_4_;
            auVar52._0_4_ = fVar146 * (float)local_680._0_4_;
            auVar52._8_4_ = fVar144 * fStack_678;
            auVar52._12_4_ = fVar212 * fStack_674;
            auVar52._16_4_ = fVar213 * fStack_670;
            auVar52._20_4_ = fVar214 * fStack_66c;
            auVar52._24_4_ = fVar215 * fStack_668;
            auVar52._28_4_ = pfVar3[7];
            auVar113 = *(undefined1 (*) [32])(lVar21 + 0x222fa60 + lVar96 * 4);
            auVar162 = vfmadd231ps_fma(auVar50,auVar113,local_5a0);
            auVar169 = vfmadd231ps_fma(auVar51,auVar113,local_760);
            auVar101 = vfmadd231ps_fma(auVar52,local_460,auVar113);
            auVar113 = *(undefined1 (*) [32])(lVar21 + 0x222f5dc + lVar96 * 4);
            auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar113,local_6a0);
            auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar113,local_5c0);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),local_100,auVar113);
            auVar113 = *(undefined1 (*) [32])(lVar21 + 0x222f158 + lVar96 * 4);
            auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar113,local_720);
            auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar113,local_400);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),local_600,auVar113);
            auVar209._8_4_ = 0x7fffffff;
            auVar209._0_8_ = 0x7fffffff7fffffff;
            auVar209._12_4_ = 0x7fffffff;
            auVar209._16_4_ = 0x7fffffff;
            auVar209._20_4_ = 0x7fffffff;
            auVar209._24_4_ = 0x7fffffff;
            auVar209._28_4_ = 0x7fffffff;
            auVar113 = vandps_avx(ZEXT1632(auVar126),auVar209);
            auVar190 = vandps_avx(ZEXT1632(auVar102),auVar209);
            auVar190 = vmaxps_avx(auVar113,auVar190);
            auVar113 = vandps_avx(ZEXT1632(auVar127),auVar209);
            auVar113 = vmaxps_avx(auVar190,auVar113);
            auVar88._4_4_ = fStack_4bc;
            auVar88._0_4_ = local_4c0;
            auVar88._8_4_ = fStack_4b8;
            auVar88._12_4_ = fStack_4b4;
            auVar88._16_4_ = fStack_4b0;
            auVar88._20_4_ = fStack_4ac;
            auVar88._24_4_ = fStack_4a8;
            auVar88._28_4_ = fStack_4a4;
            auVar113 = vcmpps_avx(auVar113,auVar88,1);
            auVar136 = vblendvps_avx(ZEXT1632(auVar126),auVar7,auVar113);
            auVar229 = vblendvps_avx(ZEXT1632(auVar102),auVar8,auVar113);
            auVar113 = vandps_avx(ZEXT1632(auVar162),auVar209);
            auVar190 = vandps_avx(ZEXT1632(auVar169),auVar209);
            auVar190 = vmaxps_avx(auVar113,auVar190);
            auVar113 = vandps_avx(auVar209,ZEXT1632(auVar101));
            auVar113 = vmaxps_avx(auVar190,auVar113);
            auVar190 = vcmpps_avx(auVar113,auVar88,1);
            auVar113 = vblendvps_avx(ZEXT1632(auVar162),auVar7,auVar190);
            auVar190 = vblendvps_avx(ZEXT1632(auVar169),auVar8,auVar190);
            auVar147 = vfmadd213ps_fma(auVar138,local_600,ZEXT1632(auVar147));
            auVar126 = vfmadd213ps_fma(auVar136,auVar136,ZEXT832(0) << 0x20);
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar229,auVar229);
            auVar138 = vrsqrtps_avx(ZEXT1632(auVar126));
            fVar146 = auVar138._0_4_;
            fVar124 = auVar138._4_4_;
            fVar144 = auVar138._8_4_;
            fVar212 = auVar138._12_4_;
            fVar213 = auVar138._16_4_;
            fVar214 = auVar138._20_4_;
            fVar215 = auVar138._24_4_;
            auVar53._4_4_ = fVar124 * fVar124 * fVar124 * auVar126._4_4_ * -0.5;
            auVar53._0_4_ = fVar146 * fVar146 * fVar146 * auVar126._0_4_ * -0.5;
            auVar53._8_4_ = fVar144 * fVar144 * fVar144 * auVar126._8_4_ * -0.5;
            auVar53._12_4_ = fVar212 * fVar212 * fVar212 * auVar126._12_4_ * -0.5;
            auVar53._16_4_ = fVar213 * fVar213 * fVar213 * -0.0;
            auVar53._20_4_ = fVar214 * fVar214 * fVar214 * -0.0;
            auVar53._24_4_ = fVar215 * fVar215 * fVar215 * -0.0;
            auVar53._28_4_ = 0;
            auVar233._8_4_ = 0x3fc00000;
            auVar233._0_8_ = 0x3fc000003fc00000;
            auVar233._12_4_ = 0x3fc00000;
            auVar233._16_4_ = 0x3fc00000;
            auVar233._20_4_ = 0x3fc00000;
            auVar233._24_4_ = 0x3fc00000;
            auVar233._28_4_ = 0x3fc00000;
            auVar126 = vfmadd231ps_fma(auVar53,auVar233,auVar138);
            fVar146 = auVar126._0_4_;
            fVar124 = auVar126._4_4_;
            auVar54._4_4_ = auVar229._4_4_ * fVar124;
            auVar54._0_4_ = auVar229._0_4_ * fVar146;
            fVar144 = auVar126._8_4_;
            auVar54._8_4_ = auVar229._8_4_ * fVar144;
            fVar212 = auVar126._12_4_;
            auVar54._12_4_ = auVar229._12_4_ * fVar212;
            auVar54._16_4_ = auVar229._16_4_ * 0.0;
            auVar54._20_4_ = auVar229._20_4_ * 0.0;
            auVar54._24_4_ = auVar229._24_4_ * 0.0;
            auVar54._28_4_ = auVar138._28_4_;
            auVar55._4_4_ = fVar124 * -auVar136._4_4_;
            auVar55._0_4_ = fVar146 * -auVar136._0_4_;
            auVar55._8_4_ = fVar144 * -auVar136._8_4_;
            auVar55._12_4_ = fVar212 * -auVar136._12_4_;
            auVar55._16_4_ = -auVar136._16_4_ * 0.0;
            auVar55._20_4_ = -auVar136._20_4_ * 0.0;
            auVar55._24_4_ = -auVar136._24_4_ * 0.0;
            auVar55._28_4_ = auVar229._28_4_;
            auVar126 = vfmadd213ps_fma(auVar113,auVar113,ZEXT832(0) << 0x20);
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar190,auVar190);
            auVar138 = vrsqrtps_avx(ZEXT1632(auVar126));
            auVar56._28_4_ = auVar8._28_4_;
            auVar56._0_28_ =
                 ZEXT1628(CONCAT412(fVar212 * 0.0,
                                    CONCAT48(fVar144 * 0.0,CONCAT44(fVar124 * 0.0,fVar146 * 0.0))));
            fVar146 = auVar138._0_4_;
            fVar124 = auVar138._4_4_;
            fVar144 = auVar138._8_4_;
            fVar212 = auVar138._12_4_;
            fVar213 = auVar138._16_4_;
            fVar214 = auVar138._20_4_;
            fVar215 = auVar138._24_4_;
            auVar57._4_4_ = fVar124 * fVar124 * fVar124 * auVar126._4_4_ * -0.5;
            auVar57._0_4_ = fVar146 * fVar146 * fVar146 * auVar126._0_4_ * -0.5;
            auVar57._8_4_ = fVar144 * fVar144 * fVar144 * auVar126._8_4_ * -0.5;
            auVar57._12_4_ = fVar212 * fVar212 * fVar212 * auVar126._12_4_ * -0.5;
            auVar57._16_4_ = fVar213 * fVar213 * fVar213 * -0.0;
            auVar57._20_4_ = fVar214 * fVar214 * fVar214 * -0.0;
            auVar57._24_4_ = fVar215 * fVar215 * fVar215 * -0.0;
            auVar57._28_4_ = 0;
            auVar126 = vfmadd231ps_fma(auVar57,auVar233,auVar138);
            fVar146 = auVar126._0_4_;
            fVar124 = auVar126._4_4_;
            auVar58._4_4_ = auVar190._4_4_ * fVar124;
            auVar58._0_4_ = auVar190._0_4_ * fVar146;
            fVar144 = auVar126._8_4_;
            auVar58._8_4_ = auVar190._8_4_ * fVar144;
            fVar212 = auVar126._12_4_;
            auVar58._12_4_ = auVar190._12_4_ * fVar212;
            auVar58._16_4_ = auVar190._16_4_ * 0.0;
            auVar58._20_4_ = auVar190._20_4_ * 0.0;
            auVar58._24_4_ = auVar190._24_4_ * 0.0;
            auVar58._28_4_ = 0;
            auVar59._4_4_ = fVar124 * -auVar113._4_4_;
            auVar59._0_4_ = fVar146 * -auVar113._0_4_;
            auVar59._8_4_ = fVar144 * -auVar113._8_4_;
            auVar59._12_4_ = fVar212 * -auVar113._12_4_;
            auVar59._16_4_ = -auVar113._16_4_ * 0.0;
            auVar59._20_4_ = -auVar113._20_4_ * 0.0;
            auVar59._24_4_ = -auVar113._24_4_ * 0.0;
            auVar59._28_4_ = auVar138._28_4_;
            auVar60._28_4_ = 0xbf000000;
            auVar60._0_28_ =
                 ZEXT1628(CONCAT412(fVar212 * 0.0,
                                    CONCAT48(fVar144 * 0.0,CONCAT44(fVar124 * 0.0,fVar146 * 0.0))));
            auVar126 = vfmadd213ps_fma(auVar54,ZEXT1632(auVar173),local_4a0);
            auVar138 = ZEXT1632(auVar173);
            auVar102 = vfmadd213ps_fma(auVar55,auVar138,auVar164);
            auVar127 = vfmadd213ps_fma(auVar56,auVar138,ZEXT1632(auVar147));
            auVar101 = vfnmadd213ps_fma(auVar54,auVar138,local_4a0);
            auVar162 = vfmadd213ps_fma(auVar58,ZEXT1632(auVar178),auVar222);
            auVar125 = vfnmadd213ps_fma(auVar55,auVar138,auVar164);
            auVar138 = ZEXT1632(auVar178);
            auVar169 = vfmadd213ps_fma(auVar59,auVar138,_local_480);
            auVar106 = ZEXT1632(auVar173);
            auVar173 = vfnmadd231ps_fma(ZEXT1632(auVar147),auVar106,auVar56);
            auVar147 = vfmadd213ps_fma(auVar60,auVar138,ZEXT1632(auVar17));
            auVar168 = vfnmadd213ps_fma(auVar58,auVar138,auVar222);
            auVar183 = vfnmadd213ps_fma(auVar59,auVar138,_local_480);
            auVar184 = vfnmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar178),auVar60);
            auVar138 = vsubps_avx(ZEXT1632(auVar169),ZEXT1632(auVar125));
            auVar113 = vsubps_avx(ZEXT1632(auVar147),ZEXT1632(auVar173));
            auVar61._4_4_ = auVar138._4_4_ * auVar173._4_4_;
            auVar61._0_4_ = auVar138._0_4_ * auVar173._0_4_;
            auVar61._8_4_ = auVar138._8_4_ * auVar173._8_4_;
            auVar61._12_4_ = auVar138._12_4_ * auVar173._12_4_;
            auVar61._16_4_ = auVar138._16_4_ * 0.0;
            auVar61._20_4_ = auVar138._20_4_ * 0.0;
            auVar61._24_4_ = auVar138._24_4_ * 0.0;
            auVar61._28_4_ = auVar8._28_4_;
            auVar17 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar125),auVar113);
            auVar62._4_4_ = auVar101._4_4_ * auVar113._4_4_;
            auVar62._0_4_ = auVar101._0_4_ * auVar113._0_4_;
            auVar62._8_4_ = auVar101._8_4_ * auVar113._8_4_;
            auVar62._12_4_ = auVar101._12_4_ * auVar113._12_4_;
            auVar62._16_4_ = auVar113._16_4_ * 0.0;
            auVar62._20_4_ = auVar113._20_4_ * 0.0;
            auVar62._24_4_ = auVar113._24_4_ * 0.0;
            auVar62._28_4_ = auVar113._28_4_;
            auVar210 = ZEXT1632(auVar101);
            auVar113 = vsubps_avx(ZEXT1632(auVar162),auVar210);
            auVar107 = ZEXT1632(auVar173);
            auVar173 = vfmsub231ps_fma(auVar62,auVar107,auVar113);
            auVar63._4_4_ = auVar125._4_4_ * auVar113._4_4_;
            auVar63._0_4_ = auVar125._0_4_ * auVar113._0_4_;
            auVar63._8_4_ = auVar125._8_4_ * auVar113._8_4_;
            auVar63._12_4_ = auVar125._12_4_ * auVar113._12_4_;
            auVar63._16_4_ = auVar113._16_4_ * 0.0;
            auVar63._20_4_ = auVar113._20_4_ * 0.0;
            auVar63._24_4_ = auVar113._24_4_ * 0.0;
            auVar63._28_4_ = auVar113._28_4_;
            auVar101 = vfmsub231ps_fma(auVar63,auVar210,auVar138);
            auVar173 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT832(0) << 0x20,ZEXT1632(auVar173));
            auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
            auVar164 = vcmpps_avx(ZEXT1632(auVar173),ZEXT832(0) << 0x20,2);
            auVar138 = vblendvps_avx(ZEXT1632(auVar168),ZEXT1632(auVar126),auVar164);
            auVar113 = vblendvps_avx(ZEXT1632(auVar183),ZEXT1632(auVar102),auVar164);
            auVar190 = vblendvps_avx(ZEXT1632(auVar184),ZEXT1632(auVar127),auVar164);
            auVar136 = vblendvps_avx(auVar210,ZEXT1632(auVar162),auVar164);
            auVar229 = vblendvps_avx(ZEXT1632(auVar125),ZEXT1632(auVar169),auVar164);
            auVar7 = vblendvps_avx(auVar107,ZEXT1632(auVar147),auVar164);
            auVar210 = vblendvps_avx(ZEXT1632(auVar162),auVar210,auVar164);
            auVar14 = vblendvps_avx(ZEXT1632(auVar169),ZEXT1632(auVar125),auVar164);
            auVar173 = vpackssdw_avx(local_1c0._0_16_,local_1c0._16_16_);
            auVar107 = vblendvps_avx(ZEXT1632(auVar147),auVar107,auVar164);
            auVar210 = vsubps_avx(auVar210,auVar138);
            auVar102 = auVar210._0_16_;
            auVar14 = vsubps_avx(auVar14,auVar113);
            auVar222 = vsubps_avx(auVar107,auVar190);
            auVar18 = vsubps_avx(auVar138,auVar136);
            auVar19 = vsubps_avx(auVar113,auVar229);
            auVar20 = vsubps_avx(auVar190,auVar7);
            auVar187._0_4_ = auVar222._0_4_ * auVar138._0_4_;
            auVar187._4_4_ = auVar222._4_4_ * auVar138._4_4_;
            auVar187._8_4_ = auVar222._8_4_ * auVar138._8_4_;
            auVar187._12_4_ = auVar222._12_4_ * auVar138._12_4_;
            auVar187._16_4_ = auVar222._16_4_ * auVar138._16_4_;
            auVar187._20_4_ = auVar222._20_4_ * auVar138._20_4_;
            auVar187._24_4_ = auVar222._24_4_ * auVar138._24_4_;
            auVar187._28_4_ = 0;
            auVar17 = vfmsub231ps_fma(auVar187,auVar190,auVar210);
            auVar64._4_4_ = auVar210._4_4_ * auVar113._4_4_;
            auVar64._0_4_ = auVar210._0_4_ * auVar113._0_4_;
            auVar64._8_4_ = auVar210._8_4_ * auVar113._8_4_;
            auVar64._12_4_ = auVar210._12_4_ * auVar113._12_4_;
            auVar64._16_4_ = auVar210._16_4_ * auVar113._16_4_;
            auVar64._20_4_ = auVar210._20_4_ * auVar113._20_4_;
            auVar64._24_4_ = auVar210._24_4_ * auVar113._24_4_;
            auVar64._28_4_ = auVar107._28_4_;
            auVar147 = vfmsub231ps_fma(auVar64,auVar138,auVar14);
            auVar227 = ZEXT864(0) << 0x20;
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar147),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
            auVar188._0_4_ = auVar14._0_4_ * auVar190._0_4_;
            auVar188._4_4_ = auVar14._4_4_ * auVar190._4_4_;
            auVar188._8_4_ = auVar14._8_4_ * auVar190._8_4_;
            auVar188._12_4_ = auVar14._12_4_ * auVar190._12_4_;
            auVar188._16_4_ = auVar14._16_4_ * auVar190._16_4_;
            auVar188._20_4_ = auVar14._20_4_ * auVar190._20_4_;
            auVar188._24_4_ = auVar14._24_4_ * auVar190._24_4_;
            auVar188._28_4_ = 0;
            auVar147 = vfmsub231ps_fma(auVar188,auVar113,auVar222);
            auVar147 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar147));
            auVar189._0_4_ = auVar20._0_4_ * auVar136._0_4_;
            auVar189._4_4_ = auVar20._4_4_ * auVar136._4_4_;
            auVar189._8_4_ = auVar20._8_4_ * auVar136._8_4_;
            auVar189._12_4_ = auVar20._12_4_ * auVar136._12_4_;
            auVar189._16_4_ = auVar20._16_4_ * auVar136._16_4_;
            auVar189._20_4_ = auVar20._20_4_ * auVar136._20_4_;
            auVar189._24_4_ = auVar20._24_4_ * auVar136._24_4_;
            auVar189._28_4_ = 0;
            auVar17 = vfmsub231ps_fma(auVar189,auVar18,auVar7);
            auVar65._4_4_ = auVar19._4_4_ * auVar7._4_4_;
            auVar65._0_4_ = auVar19._0_4_ * auVar7._0_4_;
            auVar65._8_4_ = auVar19._8_4_ * auVar7._8_4_;
            auVar65._12_4_ = auVar19._12_4_ * auVar7._12_4_;
            auVar65._16_4_ = auVar19._16_4_ * auVar7._16_4_;
            auVar65._20_4_ = auVar19._20_4_ * auVar7._20_4_;
            auVar65._24_4_ = auVar19._24_4_ * auVar7._24_4_;
            auVar65._28_4_ = auVar7._28_4_;
            auVar126 = vfmsub231ps_fma(auVar65,auVar229,auVar20);
            auVar66._4_4_ = auVar18._4_4_ * auVar229._4_4_;
            auVar66._0_4_ = auVar18._0_4_ * auVar229._0_4_;
            auVar66._8_4_ = auVar18._8_4_ * auVar229._8_4_;
            auVar66._12_4_ = auVar18._12_4_ * auVar229._12_4_;
            auVar66._16_4_ = auVar18._16_4_ * auVar229._16_4_;
            auVar66._20_4_ = auVar18._20_4_ * auVar229._20_4_;
            auVar66._24_4_ = auVar18._24_4_ * auVar229._24_4_;
            auVar66._28_4_ = auVar229._28_4_;
            auVar127 = vfmsub231ps_fma(auVar66,auVar19,auVar136);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar127),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar126));
            auVar136 = vmaxps_avx(ZEXT1632(auVar147),ZEXT1632(auVar126));
            auVar136 = vcmpps_avx(auVar136,ZEXT832(0) << 0x20,2);
            auVar17 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
            auVar17 = vpand_avx(auVar17,auVar173);
            auVar136 = vpmovsxwd_avx2(auVar17);
            if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar136 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar136 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar136 >> 0x7f,0) == '\0') &&
                  (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar136 >> 0xbf,0) == '\0') &&
                (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar136[0x1f]) {
LAB_01673a7b:
              auVar166 = ZEXT3264(CONCAT824(local_500[1]._24_8_,
                                            CONCAT816(local_500[1]._16_8_,
                                                      CONCAT88(local_500[1]._8_8_,local_500[1]._0_8_
                                                              ))));
              auVar17 = vpcmpeqd_avx(auVar102,auVar102);
              auVar211 = ZEXT1664(auVar17);
            }
            else {
              auVar67._4_4_ = auVar14._4_4_ * auVar20._4_4_;
              auVar67._0_4_ = auVar14._0_4_ * auVar20._0_4_;
              auVar67._8_4_ = auVar14._8_4_ * auVar20._8_4_;
              auVar67._12_4_ = auVar14._12_4_ * auVar20._12_4_;
              auVar67._16_4_ = auVar14._16_4_ * auVar20._16_4_;
              auVar67._20_4_ = auVar14._20_4_ * auVar20._20_4_;
              auVar67._24_4_ = auVar14._24_4_ * auVar20._24_4_;
              auVar67._28_4_ = auVar136._28_4_;
              auVar169 = vfmsub231ps_fma(auVar67,auVar19,auVar222);
              auVar194._0_4_ = auVar18._0_4_ * auVar222._0_4_;
              auVar194._4_4_ = auVar18._4_4_ * auVar222._4_4_;
              auVar194._8_4_ = auVar18._8_4_ * auVar222._8_4_;
              auVar194._12_4_ = auVar18._12_4_ * auVar222._12_4_;
              auVar194._16_4_ = auVar18._16_4_ * auVar222._16_4_;
              auVar194._20_4_ = auVar18._20_4_ * auVar222._20_4_;
              auVar194._24_4_ = auVar18._24_4_ * auVar222._24_4_;
              auVar194._28_4_ = 0;
              auVar162 = vfmsub231ps_fma(auVar194,auVar210,auVar20);
              auVar68._4_4_ = auVar210._4_4_ * auVar19._4_4_;
              auVar68._0_4_ = auVar210._0_4_ * auVar19._0_4_;
              auVar68._8_4_ = auVar210._8_4_ * auVar19._8_4_;
              auVar68._12_4_ = auVar210._12_4_ * auVar19._12_4_;
              auVar68._16_4_ = auVar210._16_4_ * auVar19._16_4_;
              auVar68._20_4_ = auVar210._20_4_ * auVar19._20_4_;
              auVar68._24_4_ = auVar210._24_4_ * auVar19._24_4_;
              auVar68._28_4_ = auVar19._28_4_;
              auVar101 = vfmsub231ps_fma(auVar68,auVar18,auVar14);
              auVar102 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar162),ZEXT1632(auVar101));
              auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT1632(auVar169),ZEXT832(0) << 0x20);
              auVar136 = vrcpps_avx(ZEXT1632(auVar102));
              auVar226._8_4_ = 0x3f800000;
              auVar226._0_8_ = &DAT_3f8000003f800000;
              auVar226._12_4_ = 0x3f800000;
              auVar226._16_4_ = 0x3f800000;
              auVar226._20_4_ = 0x3f800000;
              auVar226._24_4_ = 0x3f800000;
              auVar226._28_4_ = 0x3f800000;
              auVar227 = ZEXT3264(auVar226);
              auVar127 = vfnmadd213ps_fma(auVar136,ZEXT1632(auVar102),auVar226);
              auVar127 = vfmadd132ps_fma(ZEXT1632(auVar127),auVar136,auVar136);
              auVar69._4_4_ = auVar101._4_4_ * auVar190._4_4_;
              auVar69._0_4_ = auVar101._0_4_ * auVar190._0_4_;
              auVar69._8_4_ = auVar101._8_4_ * auVar190._8_4_;
              auVar69._12_4_ = auVar101._12_4_ * auVar190._12_4_;
              auVar69._16_4_ = auVar190._16_4_ * 0.0;
              auVar69._20_4_ = auVar190._20_4_ * 0.0;
              auVar69._24_4_ = auVar190._24_4_ * 0.0;
              auVar69._28_4_ = auVar190._28_4_;
              auVar162 = vfmadd231ps_fma(auVar69,ZEXT1632(auVar162),auVar113);
              auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),ZEXT1632(auVar169),auVar138);
              fVar146 = auVar127._0_4_;
              fVar124 = auVar127._4_4_;
              fVar144 = auVar127._8_4_;
              fVar212 = auVar127._12_4_;
              auVar190 = ZEXT1632(CONCAT412(fVar212 * auVar162._12_4_,
                                            CONCAT48(fVar144 * auVar162._8_4_,
                                                     CONCAT44(fVar124 * auVar162._4_4_,
                                                              fVar146 * auVar162._0_4_))));
              uVar98 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar165._4_4_ = uVar98;
              auVar165._0_4_ = uVar98;
              auVar165._8_4_ = uVar98;
              auVar165._12_4_ = uVar98;
              auVar165._16_4_ = uVar98;
              auVar165._20_4_ = uVar98;
              auVar165._24_4_ = uVar98;
              auVar165._28_4_ = uVar98;
              auVar89._4_4_ = uStack_13c;
              auVar89._0_4_ = local_140;
              auVar89._8_4_ = uStack_138;
              auVar89._12_4_ = uStack_134;
              auVar89._16_4_ = uStack_130;
              auVar89._20_4_ = uStack_12c;
              auVar89._24_4_ = uStack_128;
              auVar89._28_4_ = uStack_124;
              auVar138 = vcmpps_avx(auVar89,auVar190,2);
              auVar113 = vcmpps_avx(auVar190,auVar165,2);
              auVar138 = vandps_avx(auVar113,auVar138);
              auVar127 = vpackssdw_avx(auVar138._0_16_,auVar138._16_16_);
              auVar17 = vpand_avx(auVar17,auVar127);
              auVar138 = vpmovsxwd_avx2(auVar17);
              if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar138 >> 0x7f,0) == '\0') &&
                    (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar138 >> 0xbf,0) == '\0') &&
                  (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar138[0x1f]) goto LAB_01673a7b;
              auVar138 = vcmpps_avx(ZEXT1632(auVar102),ZEXT832(0) << 0x20,4);
              auVar127 = auVar138._16_16_;
              auVar102 = vpackssdw_avx(auVar138._0_16_,auVar127);
              auVar17 = vpand_avx(auVar17,auVar102);
              auVar138 = vpmovsxwd_avx2(auVar17);
              auVar166 = ZEXT3264(CONCAT824(local_500[1]._24_8_,
                                            CONCAT816(local_500[1]._16_8_,
                                                      CONCAT88(local_500[1]._8_8_,local_500[1]._0_8_
                                                              ))));
              auVar17 = vpcmpeqd_avx(auVar127,auVar127);
              auVar211 = ZEXT1664(auVar17);
              if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar138 >> 0x7f,0) != '\0') ||
                    (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar138 >> 0xbf,0) != '\0') ||
                  (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar138[0x1f] < '\0') {
                auVar136 = ZEXT1632(CONCAT412(fVar212 * auVar147._12_4_,
                                              CONCAT48(fVar144 * auVar147._8_4_,
                                                       CONCAT44(fVar124 * auVar147._4_4_,
                                                                fVar146 * auVar147._0_4_))));
                auVar70._28_4_ = SUB84(local_500[1]._24_8_,4);
                auVar70._0_28_ =
                     ZEXT1628(CONCAT412(fVar212 * auVar126._12_4_,
                                        CONCAT48(fVar144 * auVar126._8_4_,
                                                 CONCAT44(fVar124 * auVar126._4_4_,
                                                          fVar146 * auVar126._0_4_))));
                auVar223._8_4_ = 0x3f800000;
                auVar223._0_8_ = &DAT_3f8000003f800000;
                auVar223._12_4_ = 0x3f800000;
                auVar223._16_4_ = 0x3f800000;
                auVar223._20_4_ = 0x3f800000;
                auVar223._24_4_ = 0x3f800000;
                auVar223._28_4_ = 0x3f800000;
                auVar113 = vsubps_avx(auVar223,auVar136);
                local_120 = vblendvps_avx(auVar113,auVar136,auVar164);
                auVar113 = vsubps_avx(auVar223,auVar70);
                local_200 = vblendvps_avx(auVar113,auVar70,auVar164);
                auVar166 = ZEXT3264(auVar138);
                local_440 = auVar190;
              }
            }
            auVar217 = ZEXT3264(local_740);
            auVar204 = ZEXT3264(local_760);
            auVar138 = auVar166._0_32_;
            if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar138 >> 0x7f,0) == '\0') &&
                  (auVar166 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar138 >> 0xbf,0) == '\0') &&
                (auVar166 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar166[0x1f]) goto LAB_01673702;
            auVar113 = vsubps_avx(ZEXT1632(auVar178),auVar106);
            auVar178 = vfmadd213ps_fma(auVar113,local_120,auVar106);
            fVar146 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            auVar71._4_4_ = (auVar178._4_4_ + auVar178._4_4_) * fVar146;
            auVar71._0_4_ = (auVar178._0_4_ + auVar178._0_4_) * fVar146;
            auVar71._8_4_ = (auVar178._8_4_ + auVar178._8_4_) * fVar146;
            auVar71._12_4_ = (auVar178._12_4_ + auVar178._12_4_) * fVar146;
            auVar71._16_4_ = fVar146 * 0.0;
            auVar71._20_4_ = fVar146 * 0.0;
            auVar71._24_4_ = fVar146 * 0.0;
            auVar71._28_4_ = fVar146;
            auVar113 = vcmpps_avx(local_440,auVar71,6);
            auVar190 = auVar138 & auVar113;
            auVar200 = ZEXT3264(local_6a0);
            auVar195 = ZEXT3264(local_720);
            if ((((((((auVar190 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar190 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar190 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar190 >> 0x7f,0) == '\0') &&
                  (auVar190 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar190 >> 0xbf,0) == '\0') &&
                (auVar190 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar190[0x1f]) {
              auVar143 = ZEXT3264(local_5c0);
            }
            else {
              local_280 = vandps_avx(auVar113,auVar138);
              auVar139._8_4_ = 0xbf800000;
              auVar139._0_8_ = 0xbf800000bf800000;
              auVar139._12_4_ = 0xbf800000;
              auVar139._16_4_ = 0xbf800000;
              auVar139._20_4_ = 0xbf800000;
              auVar139._24_4_ = 0xbf800000;
              auVar139._28_4_ = 0xbf800000;
              auVar159._8_4_ = 0x40000000;
              auVar159._0_8_ = 0x4000000040000000;
              auVar159._12_4_ = 0x40000000;
              auVar159._16_4_ = 0x40000000;
              auVar159._20_4_ = 0x40000000;
              auVar159._24_4_ = 0x40000000;
              auVar159._28_4_ = 0x40000000;
              auVar178 = vfmadd213ps_fma(local_200,auVar159,auVar139);
              auVar166 = ZEXT1664(auVar178);
              local_340 = local_120;
              local_200 = ZEXT1632(auVar178);
              auVar138 = local_200;
              local_320 = ZEXT1632(auVar178);
              local_300 = local_440;
              local_2dc = iVar10;
              local_2d0 = uVar82;
              uStack_2c8 = uVar83;
              local_2c0 = local_620._0_8_;
              uStack_2b8 = local_620._8_8_;
              local_2b0 = local_630._0_8_;
              uStack_2a8 = local_630._8_8_;
              local_2a0 = local_640;
              uStack_298 = uStack_638;
              pGVar95 = (context->scene->geometries).items[(uint)local_7a0._4_4_].ptr;
              if ((pGVar95->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                auVar227 = ZEXT1264(ZEXT812(0));
                fVar146 = (float)local_2e0;
                local_260[0] = (fVar146 + local_120._0_4_ + 0.0) * local_420;
                local_260[1] = (fVar146 + local_120._4_4_ + 1.0) * (float)auStack_41c._0_4_;
                local_260[2] = (fVar146 + local_120._8_4_ + 2.0) * (float)auStack_41c._4_4_;
                local_260[3] = (fVar146 + local_120._12_4_ + 3.0) * fStack_414;
                fStack_250 = (fVar146 + local_120._16_4_ + 4.0) * fStack_410;
                fStack_24c = (fVar146 + local_120._20_4_ + 5.0) * fStack_40c;
                fStack_248 = (fVar146 + local_120._24_4_ + 6.0) * fStack_408;
                fStack_244 = fVar146 + local_120._28_4_ + 7.0;
                local_200._0_8_ = auVar178._0_8_;
                local_200._8_8_ = auVar178._8_8_;
                local_240 = local_200._0_8_;
                uStack_238 = local_200._8_8_;
                uStack_230 = 0;
                uStack_228 = 0;
                local_220 = local_440;
                auVar140._8_4_ = 0x7f800000;
                auVar140._0_8_ = 0x7f8000007f800000;
                auVar140._12_4_ = 0x7f800000;
                auVar140._16_4_ = 0x7f800000;
                auVar140._20_4_ = 0x7f800000;
                auVar140._24_4_ = 0x7f800000;
                auVar140._28_4_ = 0x7f800000;
                auVar113 = vblendvps_avx(auVar140,local_440,local_280);
                auVar190 = vshufps_avx(auVar113,auVar113,0xb1);
                auVar190 = vminps_avx(auVar113,auVar190);
                auVar136 = vshufpd_avx(auVar190,auVar190,5);
                auVar190 = vminps_avx(auVar190,auVar136);
                auVar136 = vpermpd_avx2(auVar190,0x4e);
                auVar190 = vminps_avx(auVar190,auVar136);
                auVar190 = vcmpps_avx(auVar113,auVar190,0);
                auVar136 = local_280 & auVar190;
                auVar113 = local_280;
                if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar136 >> 0x7f,0) != '\0') ||
                      (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar136 >> 0xbf,0) != '\0') ||
                    (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar136[0x1f] < '\0') {
                  auVar113 = vandps_avx(auVar190,local_280);
                }
                uVar91 = vmovmskps_avx(auVar113);
                uVar93 = 0;
                for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
                  uVar93 = uVar93 + 1;
                }
                uVar92 = (ulong)uVar93;
                local_800 = ZEXT1632(CONCAT88(auVar173._8_8_,uVar92));
                local_200 = auVar138;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar95->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar146 = local_260[uVar92];
                  uVar98 = *(undefined4 *)((long)&local_240 + uVar92 * 4);
                  fVar124 = 1.0 - fVar146;
                  auVar173 = ZEXT416((uint)(fVar146 * fVar124 * 4.0));
                  auVar178 = vfnmsub213ss_fma(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),auVar173
                                             );
                  auVar173 = vfmadd213ss_fma(ZEXT416((uint)fVar124),ZEXT416((uint)fVar124),auVar173)
                  ;
                  fVar124 = fVar124 * -fVar124 * 0.5;
                  fVar144 = auVar178._0_4_ * 0.5;
                  fVar212 = auVar173._0_4_ * 0.5;
                  fVar213 = fVar146 * fVar146 * 0.5;
                  auVar174._0_4_ = fVar213 * (float)local_640._0_4_;
                  auVar174._4_4_ = fVar213 * (float)local_640._4_4_;
                  auVar174._8_4_ = fVar213 * (float)uStack_638;
                  auVar174._12_4_ = fVar213 * uStack_638._4_4_;
                  auVar150._4_4_ = fVar212;
                  auVar150._0_4_ = fVar212;
                  auVar150._8_4_ = fVar212;
                  auVar150._12_4_ = fVar212;
                  auVar173 = vfmadd132ps_fma(auVar150,auVar174,local_630);
                  auVar175._4_4_ = fVar144;
                  auVar175._0_4_ = fVar144;
                  auVar175._8_4_ = fVar144;
                  auVar175._12_4_ = fVar144;
                  auVar173 = vfmadd132ps_fma(auVar175,auVar173,local_620);
                  auVar151._4_4_ = fVar124;
                  auVar151._0_4_ = fVar124;
                  auVar151._8_4_ = fVar124;
                  auVar151._12_4_ = fVar124;
                  auVar173 = vfmadd132ps_fma(auVar151,auVar173,auVar13);
                  auVar166 = ZEXT464(*(uint *)(local_220 + uVar92 * 4));
                  *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_220 + uVar92 * 4);
                  *(int *)(ray + k * 4 + 0xc0) = auVar173._0_4_;
                  uVar218 = vextractps_avx(auVar173,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar218;
                  uVar218 = vextractps_avx(auVar173,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar218;
                  *(float *)(ray + k * 4 + 0xf0) = fVar146;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar98;
                  *(undefined4 *)(ray + k * 4 + 0x110) = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0x120) = local_7a0._4_4_;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  _local_520 = _local_640;
                  local_580 = ZEXT1632(*local_608);
                  local_5e0 = ZEXT1632(CONCAT88(auVar16._8_8_,lVar96));
                  local_540._8_24_ = auVar8._8_24_;
                  local_540._0_8_ = pGVar95;
                  local_500[0] = local_280;
                  do {
                    auVar138 = local_800;
                    uVar98 = *(undefined4 *)(ray + k * 4 + 0x80);
                    fVar146 = local_260[local_800._0_8_];
                    local_3a0._4_4_ = fVar146;
                    local_3a0._0_4_ = fVar146;
                    local_3a0._8_4_ = fVar146;
                    local_3a0._12_4_ = fVar146;
                    local_390._4_4_ = *(undefined4 *)((long)&local_240 + local_800._0_8_ * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) =
                         *(undefined4 *)(local_220 + local_800._0_8_ * 4);
                    fVar144 = 1.0 - fVar146;
                    auVar173 = ZEXT416((uint)(fVar146 * fVar144 * 4.0));
                    auVar178 = vfnmsub213ss_fma(local_3a0,local_3a0,auVar173);
                    auVar173 = vfmadd213ss_fma(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144),
                                               auVar173);
                    fVar124 = auVar173._0_4_ * 0.5;
                    fVar146 = fVar146 * fVar146 * 0.5;
                    auVar176._0_4_ = fVar146 * (float)local_520._0_4_;
                    auVar176._4_4_ = fVar146 * (float)local_520._4_4_;
                    auVar176._8_4_ = fVar146 * fStack_518;
                    auVar176._12_4_ = fVar146 * fStack_514;
                    auVar152._4_4_ = fVar124;
                    auVar152._0_4_ = fVar124;
                    auVar152._8_4_ = fVar124;
                    auVar152._12_4_ = fVar124;
                    auVar173 = vfmadd132ps_fma(auVar152,auVar176,auVar104);
                    fVar146 = auVar178._0_4_ * 0.5;
                    auVar177._4_4_ = fVar146;
                    auVar177._0_4_ = fVar146;
                    auVar177._8_4_ = fVar146;
                    auVar177._12_4_ = fVar146;
                    auVar173 = vfmadd132ps_fma(auVar177,auVar173,auVar103);
                    local_6f0.context = context->user;
                    fVar146 = fVar144 * -fVar144 * 0.5;
                    auVar153._4_4_ = fVar146;
                    auVar153._0_4_ = fVar146;
                    auVar153._8_4_ = fVar146;
                    auVar153._12_4_ = fVar146;
                    auVar173 = vfmadd132ps_fma(auVar153,auVar173,auVar15);
                    local_3d0 = auVar173._0_4_;
                    uStack_3cc = local_3d0;
                    uStack_3c8 = local_3d0;
                    uStack_3c4 = local_3d0;
                    local_3c0 = vshufps_avx(auVar173,auVar173,0x55);
                    local_3b0 = vshufps_avx(auVar173,auVar173,0xaa);
                    local_390._0_4_ = local_390._4_4_;
                    local_390._8_4_ = local_390._4_4_;
                    local_390._12_4_ = local_390._4_4_;
                    local_380 = CONCAT44(uStack_17c,local_180);
                    uStack_378 = CONCAT44(uStack_174,uStack_178);
                    local_370._4_4_ = uStack_16c;
                    local_370._0_4_ = local_170;
                    local_370._8_4_ = uStack_168;
                    local_370._12_4_ = uStack_164;
                    vpcmpeqd_avx2(ZEXT1632(local_370),ZEXT1632(local_370));
                    uStack_35c = (local_6f0.context)->instID[0];
                    local_360 = uStack_35c;
                    uStack_358 = uStack_35c;
                    uStack_354 = uStack_35c;
                    uStack_350 = (local_6f0.context)->instPrimID[0];
                    uStack_34c = uStack_350;
                    uStack_348 = uStack_350;
                    uStack_344 = uStack_350;
                    local_770 = local_580._0_8_;
                    uStack_768 = local_580._8_8_;
                    local_6f0.valid = (int *)&local_770;
                    local_6f0.geometryUserPtr = pGVar95->userPtr;
                    local_6f0.hit = (RTCHitN *)&local_3d0;
                    local_6f0.N = 4;
                    local_6f0.ray = (RTCRayN *)ray;
                    if (pGVar95->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar173 = auVar211._0_16_;
                      auVar227 = ZEXT1664(auVar227._0_16_);
                      (*pGVar95->intersectionFilterN)(&local_6f0);
                      auVar200 = ZEXT3264(local_6a0);
                      auVar204 = ZEXT3264(local_760);
                      auVar217 = ZEXT3264(local_740);
                      auVar173 = vpcmpeqd_avx(auVar173,auVar173);
                      auVar211 = ZEXT1664(auVar173);
                      pGVar95 = (Geometry *)local_540._0_8_;
                      lVar96 = local_5e0._0_8_;
                      fVar99 = local_660;
                      fVar116 = fStack_65c;
                      fVar118 = fStack_658;
                      fVar120 = fStack_654;
                      fVar121 = fStack_650;
                      fVar122 = fStack_64c;
                      fVar123 = fStack_648;
                      fVar160 = fStack_644;
                      fVar161 = (float)local_6c0;
                      fVar167 = local_6c0._4_4_;
                      fVar145 = (float)uStack_6b8;
                      fVar117 = uStack_6b8._4_4_;
                      fVar119 = (float)uStack_6b0;
                      fVar234 = uStack_6b0._4_4_;
                      fVar235 = (float)uStack_6a8;
                    }
                    auVar84._8_8_ = uStack_768;
                    auVar84._0_8_ = local_770;
                    auVar173 = auVar211._0_16_;
                    if (auVar84 == (undefined1  [16])0x0) {
                      auVar178 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar173 = auVar173 ^ auVar178;
                      auVar166 = ZEXT3264(local_440);
                    }
                    else {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar95->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar227 = ZEXT1664(auVar227._0_16_);
                        (*p_Var11)(&local_6f0);
                        auVar200 = ZEXT3264(local_6a0);
                        auVar204 = ZEXT3264(local_760);
                        auVar217 = ZEXT3264(local_740);
                        auVar173 = vpcmpeqd_avx(auVar173,auVar173);
                        auVar211 = ZEXT1664(auVar173);
                        pGVar95 = (Geometry *)local_540._0_8_;
                        lVar96 = local_5e0._0_8_;
                        fVar99 = local_660;
                        fVar116 = fStack_65c;
                        fVar118 = fStack_658;
                        fVar120 = fStack_654;
                        fVar121 = fStack_650;
                        fVar122 = fStack_64c;
                        fVar123 = fStack_648;
                        fVar160 = fStack_644;
                        fVar161 = (float)local_6c0;
                        fVar167 = local_6c0._4_4_;
                        fVar145 = (float)uStack_6b8;
                        fVar117 = uStack_6b8._4_4_;
                        fVar119 = (float)uStack_6b0;
                        fVar234 = uStack_6b0._4_4_;
                        fVar235 = (float)uStack_6a8;
                      }
                      auVar85._8_8_ = uStack_768;
                      auVar85._0_8_ = local_770;
                      auVar178 = vpcmpeqd_avx(auVar85,_DAT_01feba10);
                      auVar173 = auVar211._0_16_ ^ auVar178;
                      auVar166 = ZEXT3264(local_440);
                      if (auVar85 != (undefined1  [16])0x0) {
                        auVar178 = auVar211._0_16_ ^ auVar178;
                        auVar16 = vmaskmovps_avx(auVar178,*(undefined1 (*) [16])local_6f0.hit);
                        *(undefined1 (*) [16])(local_6f0.ray + 0xc0) = auVar16;
                        auVar16 = vmaskmovps_avx(auVar178,*(undefined1 (*) [16])
                                                           (local_6f0.hit + 0x10));
                        *(undefined1 (*) [16])(local_6f0.ray + 0xd0) = auVar16;
                        auVar16 = vmaskmovps_avx(auVar178,*(undefined1 (*) [16])
                                                           (local_6f0.hit + 0x20));
                        *(undefined1 (*) [16])(local_6f0.ray + 0xe0) = auVar16;
                        auVar16 = vmaskmovps_avx(auVar178,*(undefined1 (*) [16])
                                                           (local_6f0.hit + 0x30));
                        *(undefined1 (*) [16])(local_6f0.ray + 0xf0) = auVar16;
                        auVar16 = vmaskmovps_avx(auVar178,*(undefined1 (*) [16])
                                                           (local_6f0.hit + 0x40));
                        *(undefined1 (*) [16])(local_6f0.ray + 0x100) = auVar16;
                        auVar16 = vmaskmovps_avx(auVar178,*(undefined1 (*) [16])
                                                           (local_6f0.hit + 0x50));
                        *(undefined1 (*) [16])(local_6f0.ray + 0x110) = auVar16;
                        auVar16 = vmaskmovps_avx(auVar178,*(undefined1 (*) [16])
                                                           (local_6f0.hit + 0x60));
                        *(undefined1 (*) [16])(local_6f0.ray + 0x120) = auVar16;
                        auVar16 = vmaskmovps_avx(auVar178,*(undefined1 (*) [16])
                                                           (local_6f0.hit + 0x70));
                        *(undefined1 (*) [16])(local_6f0.ray + 0x130) = auVar16;
                        auVar178 = vmaskmovps_avx(auVar178,*(undefined1 (*) [16])
                                                            (local_6f0.hit + 0x80));
                        *(undefined1 (*) [16])(local_6f0.ray + 0x140) = auVar178;
                      }
                    }
                    auVar128._8_8_ = 0x100000001;
                    auVar128._0_8_ = 0x100000001;
                    if ((auVar128 & auVar173) == (undefined1  [16])0x0) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar98;
                    }
                    *(undefined4 *)(local_500[0] + local_800._0_8_ * 4) = 0;
                    uVar98 = *(undefined4 *)(ray + k * 4 + 0x80);
                    auVar114._4_4_ = uVar98;
                    auVar114._0_4_ = uVar98;
                    auVar114._8_4_ = uVar98;
                    auVar114._12_4_ = uVar98;
                    auVar114._16_4_ = uVar98;
                    auVar114._20_4_ = uVar98;
                    auVar114._24_4_ = uVar98;
                    auVar114._28_4_ = uVar98;
                    auVar190 = vcmpps_avx(auVar166._0_32_,auVar114,2);
                    auVar113 = vandps_avx(auVar190,local_500[0]);
                    local_500[0] = local_500[0] & auVar190;
                    bVar79 = (local_500[0] >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                    ;
                    bVar80 = (local_500[0] >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                    ;
                    bVar78 = (local_500[0] >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                    ;
                    bVar77 = SUB321(local_500[0] >> 0x7f,0) != '\0';
                    bVar76 = (local_500[0] & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                    ;
                    bVar75 = SUB321(local_500[0] >> 0xbf,0) != '\0';
                    bVar73 = (local_500[0] & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                    ;
                    bVar72 = local_500[0][0x1f] < '\0';
                    if (((((((bVar79 || bVar80) || bVar78) || bVar77) || bVar76) || bVar75) ||
                        bVar73) || bVar72) {
                      auVar141._8_4_ = 0x7f800000;
                      auVar141._0_8_ = 0x7f8000007f800000;
                      auVar141._12_4_ = 0x7f800000;
                      auVar141._16_4_ = 0x7f800000;
                      auVar141._20_4_ = 0x7f800000;
                      auVar141._24_4_ = 0x7f800000;
                      auVar141._28_4_ = 0x7f800000;
                      auVar190 = vblendvps_avx(auVar141,auVar166._0_32_,auVar113);
                      auVar136 = vshufps_avx(auVar190,auVar190,0xb1);
                      auVar136 = vminps_avx(auVar190,auVar136);
                      auVar229 = vshufpd_avx(auVar136,auVar136,5);
                      auVar136 = vminps_avx(auVar136,auVar229);
                      auVar229 = vpermpd_avx2(auVar136,0x4e);
                      auVar166 = ZEXT3264(auVar229);
                      auVar136 = vminps_avx(auVar136,auVar229);
                      auVar136 = vcmpps_avx(auVar190,auVar136,0);
                      auVar229 = auVar113 & auVar136;
                      auVar190 = auVar113;
                      if ((((((((auVar229 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar229 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar229 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar229 >> 0x7f,0) != '\0') ||
                            (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar229 >> 0xbf,0) != '\0') ||
                          (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar229[0x1f] < '\0') {
                        auVar190 = vandps_avx(auVar136,auVar113);
                      }
                      uVar93 = vmovmskps_avx(auVar190);
                      local_800._0_4_ = 0;
                      for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                        local_800._0_4_ = local_800._0_4_ + 1;
                      }
                      local_800._4_4_ = 0;
                      local_800._8_24_ = auVar138._8_24_;
                    }
                    local_500[0] = auVar113;
                  } while (((((((bVar79 || bVar80) || bVar78) || bVar77) || bVar76) || bVar75) ||
                           bVar73) || bVar72);
                }
                auVar195 = ZEXT3264(local_720);
              }
              auVar143 = ZEXT3264(local_5c0);
            }
          }
          lVar96 = lVar96 + 8;
          auVar211 = ZEXT3264(local_560);
        } while ((int)lVar96 < iVar10);
      }
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar105._4_4_ = uVar4;
      auVar105._0_4_ = uVar4;
      auVar105._8_4_ = uVar4;
      auVar105._12_4_ = uVar4;
      auVar173 = vcmpps_avx(local_160,auVar105,2);
      uVar93 = vmovmskps_avx(auVar173);
      uVar93 = (uint)uVar97 & uVar93;
    } while (uVar93 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }